

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_2UL>
  *pHVar1;
  atomic<unsigned_long> *paVar2;
  pointer *pppTVar3;
  BBox1f BVar4;
  MemoryMonitorInterface *pMVar5;
  ThreadLocal2 *pTVar6;
  iterator iVar7;
  BBox1f *pBVar8;
  PrimRefMB *pPVar9;
  Ref<embree::Geometry> *pRVar10;
  Geometry *pGVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  BBox1f BVar29;
  bool bVar30;
  bool bVar31;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar32;
  BBox1f BVar33;
  char cVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  void *pvVar39;
  ulong uVar40;
  float *pfVar41;
  size_t sVar42;
  undefined8 *puVar43;
  runtime_error *prVar44;
  char *pcVar45;
  BBox1f *pBVar46;
  char *pcVar47;
  ulong uVar48;
  BBox1f BVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  long *plVar53;
  long lVar54;
  long lVar55;
  vfloat_impl<4> *this_00;
  ulong uVar56;
  BuildRecord *in_00;
  long lVar57;
  mvector<PrimRefMB> *prims;
  bool bVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  float fVar66;
  undefined1 auVar65 [16];
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar72;
  float fVar73;
  undefined1 auVar71 [16];
  float fVar74;
  float fVar76;
  float fVar77;
  undefined1 auVar75 [16];
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  float fVar92;
  undefined1 auVar93 [16];
  float fVar95;
  float fVar96;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar94;
  float fVar97;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar99;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar100;
  BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>,_embree::Scene::BuildProgressMonitorInterface>
  *this_01;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1ed8 [16];
  undefined1 local_1ec8 [16];
  float local_1ea8;
  float fStack_1ea4;
  float fStack_1ea0;
  float fStack_1e9c;
  float local_1e98;
  float fStack_1e94;
  float fStack_1e90;
  float fStack_1e8c;
  undefined1 local_1e78 [16];
  undefined1 local_1e68 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  Vec3vf<4> vc1;
  BBox1f BStack_1db0;
  Vec3vf<4> vb1;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1d58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d38;
  BBox1f local_1d28;
  BBox1f BStack_1d20;
  float local_1d08;
  float fStack_1d04;
  float fStack_1d00;
  float fStack_1cfc;
  Vec3vf<4> vc0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c88;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1c78;
  BBox1f local_1c68;
  char acStack_1c60 [16];
  BBox1f BStack_1c50;
  BBox1f local_1c48;
  BBox1f BStack_1c40;
  size_t local_1c38;
  size_t sStack_1c30;
  BBox1f local_1c28;
  BBox1f BStack_1c20;
  BBox1f local_1c18;
  anon_class_1_0_00000001 reduction;
  Vec3vf<4> va1;
  undefined8 local_1b78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1b70;
  unsigned_long uStack_1b60;
  unsigned_long local_1b58;
  size_t sStack_1b50;
  size_t local_1b48;
  BBox1f BStack_1b40;
  BBox1f local_1b38;
  BBox1f BStack_1b30;
  size_t local_1b28;
  size_t sStack_1b20;
  BBox1f local_1b18;
  BBox1f BStack_1b10;
  BBox1f local_1b08;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_1a38 [16];
  vuint<4> vgeomID;
  vuint<4> vprimID;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  int local_18e8;
  int iStack_18e4;
  int iStack_18e0;
  int iStack_18dc;
  float local_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  float local_18c8;
  float fStack_18c4;
  float fStack_18c0;
  float fStack_18bc;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  BBox1f local_18a8;
  BBox1f BStack_18a0;
  size_t local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  BBox1f BStack_1880;
  BBox1f local_1878;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 local_1848;
  undefined8 uStack_1840;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1828;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1818;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1808;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17f8;
  float local_17e8;
  float fStack_17e4;
  float fStack_17e0;
  float fStack_17dc;
  undefined1 local_17d8 [16];
  Vec3vf<4> va0;
  undefined1 local_1798 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1788;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1768;
  BBox1f local_1758 [2];
  size_t local_1748 [2];
  BBox1f local_1738;
  float fStack_1730;
  float fStack_172c;
  BBox1f local_1728 [2];
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708 [456];
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  BBox1f local_838 [63];
  long local_640;
  NodeRecordMB4D values [16];
  
  uVar40 = in->depth;
  if ((this->cfg).maxDepth < uVar40) {
    puVar43 = (undefined8 *)__cxa_allocate_exception(0x30);
    va0.field_0._0_8_ = (long)&va0.field_0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&va0,"depth limit reached","");
    *puVar43 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar43 + 1) = 1;
    puVar43[2] = puVar43 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar43 + 2),va0.field_0._0_8_,va0.field_0._8_8_ + va0.field_0._0_8_);
    __cxa_throw(puVar43,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar17 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.lower.field_0;
  uVar18 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.lower.field_0 + 8);
  uVar19 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.upper.field_0;
  uVar20 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.upper.field_0 + 8);
  uVar21 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds1.lower.field_0;
  uVar22 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds1.lower.field_0 + 8);
  uVar23 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds1.upper.field_0;
  uVar24 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds1.upper.field_0 + 8);
  uVar25 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
             lower.field_0;
  uVar26 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    centBounds.lower.field_0 + 8);
  uVar27 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
             upper.field_0;
  uVar28 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    centBounds.upper.field_0 + 8);
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  BVar4 = (BBox1f)(in->prims).prims;
  BVar49 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._begin;
  BVar29 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._end;
  findFallback((Split *)&va0,this,&in->prims);
  local_1708[3] = va0.field_0._40_8_;
  local_1708[2] = va0.field_0._32_8_;
  local_1708[0] = va0.field_0._16_8_;
  local_1718 = va0.field_0._0_8_;
  local_1ea8 = (float)uVar25;
  fStack_1ea4 = (float)((ulong)uVar25 >> 0x20);
  fStack_1ea0 = (float)uVar26;
  fStack_1e9c = (float)((ulong)uVar26 >> 0x20);
  local_1e98 = (float)uVar23;
  fStack_1e94 = (float)((ulong)uVar23 >> 0x20);
  fStack_1e90 = (float)uVar24;
  fStack_1e8c = (float)((ulong)uVar24 >> 0x20);
  local_1ed8._0_4_ = (undefined4)uVar21;
  local_1ed8._4_4_ = (undefined4)((ulong)uVar21 >> 0x20);
  local_1ed8._8_4_ = (undefined4)uVar22;
  local_1ed8._12_4_ = (undefined4)((ulong)uVar22 >> 0x20);
  local_1908 = uVar17;
  uStack_1900 = uVar18;
  local_18f8 = uVar19;
  uStack_18f0 = uVar20;
  local_18e8 = local_1ed8._0_4_;
  iStack_18e4 = local_1ed8._4_4_;
  iStack_18e0 = local_1ed8._8_4_;
  iStack_18dc = local_1ed8._12_4_;
  local_18d8 = local_1e98;
  fStack_18d4 = fStack_1e94;
  fStack_18d0 = fStack_1e90;
  fStack_18cc = fStack_1e8c;
  local_18c8 = local_1ea8;
  fStack_18c4 = fStack_1ea4;
  fStack_18c0 = fStack_1ea0;
  fStack_18bc = fStack_1e9c;
  local_18b8 = uVar27;
  uStack_18b0 = uVar28;
  local_18a8 = BVar49;
  BStack_18a0 = BVar29;
  local_1898 = values[0].ref.ptr;
  uStack_1890 = values[0]._8_8_;
  local_1888 = values[0].lbounds.bounds0.lower.field_0._0_8_;
  BStack_1880.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  BStack_1880.upper = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar33 = BStack_1880;
  local_1878 = BVar4;
  local_1868 = va0.field_0._0_8_;
  uStack_1860 = va0.field_0._8_8_;
  local_1858 = va0.field_0._16_8_;
  local_1848 = va0.field_0._32_8_;
  uStack_1840 = va0.field_0._40_8_;
  if ((uVar40 == 1) && (BVar29 != BVar49)) {
    BStack_1880.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    BStack_1880.upper = (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar38 = (long)BVar29 - (long)BVar49;
    if ((ulong)BVar29 < (ulong)BVar49 || lVar38 == 0) {
      fVar88 = INFINITY;
      fVar92 = -INFINITY;
    }
    else {
      pfVar41 = &(*(PrimRefMB **)((long)BVar4 + 0x20))[(long)BVar49].time_range.upper;
      fVar88 = INFINITY;
      fVar91 = -INFINITY;
      do {
        if (((BBox1f *)(pfVar41 + -1))->lower <= fVar88) {
          fVar88 = ((BBox1f *)(pfVar41 + -1))->lower;
        }
        fVar92 = *pfVar41;
        if (*pfVar41 <= fVar91) {
          fVar92 = fVar91;
        }
        pfVar41 = pfVar41 + 0x14;
        lVar38 = lVar38 + -1;
        fVar91 = fVar92;
      } while (lVar38 != 0);
    }
    bVar30 = BStack_1880.lower < fVar88 || fVar92 < BStack_1880.upper;
  }
  else {
    bVar30 = false;
  }
  BStack_1880 = BVar33;
  if ((((ulong)((long)BVar29 - (long)BVar49) <= (this->cfg).maxLeafSize) &&
      (uStack_1860._4_4_ = (uint)((ulong)va0.field_0._8_8_ >> 0x20), uStack_1860._4_4_ < 2)) &&
     (!bVar30)) {
    uVar56 = ((long)BVar29 - (long)BVar49) + 3;
    uVar40 = uVar56 >> 2;
    va1.field_0._0_8_ = uVar40 * 0x140;
    pTVar6 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar6->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar6;
      MutexSys::lock(&pTVar6->mutex);
      if ((pTVar6->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar6->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar6->alloc1).bytesUsed + (pTVar6->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar6->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar6->alloc0).end + (pTVar6->alloc1).end) -
             ((pTVar6->alloc0).cur + (pTVar6->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar6->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar6->alloc1).bytesWasted + (pTVar6->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar6->alloc0).bytesUsed = 0;
      (pTVar6->alloc0).bytesWasted = 0;
      (pTVar6->alloc0).end = 0;
      (pTVar6->alloc0).allocBlockSize = 0;
      (pTVar6->alloc0).ptr = (char *)0x0;
      (pTVar6->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar6->alloc1).bytesUsed = 0;
        (pTVar6->alloc1).bytesWasted = 0;
        (pTVar6->alloc1).end = 0;
        (pTVar6->alloc1).allocBlockSize = 0;
        (pTVar6->alloc1).ptr = (char *)0x0;
        (pTVar6->alloc1).cur = 0;
      }
      else {
        (pTVar6->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar6->alloc1).ptr = (char *)0x0;
        (pTVar6->alloc1).cur = 0;
        (pTVar6->alloc1).end = 0;
        (pTVar6->alloc1).allocBlockSize = 0;
        (pTVar6->alloc1).bytesUsed = 0;
        (pTVar6->alloc1).bytesWasted = 0;
        (pTVar6->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar6->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      va0.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      va0.field_0._8_1_ = 1;
      vc0.field_0._0_8_ = pTVar6;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar7._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar7,(ThreadLocal2 **)&vc0);
      }
      else {
        *iVar7._M_current = (ThreadLocal2 *)vc0.field_0._0_8_;
        pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar3 = *pppTVar3 + 1;
      }
      if (va0.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)va0.field_0._0_8_);
      }
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + va1.field_0._0_8_;
    sVar42 = (alloc.talloc1)->cur;
    uVar50 = (ulong)(-(int)sVar42 & 0xf);
    uVar48 = sVar42 + va1.field_0._0_8_ + uVar50;
    (alloc.talloc1)->cur = uVar48;
    if ((alloc.talloc1)->end < uVar48) {
      (alloc.talloc1)->cur = sVar42;
      if ((alloc.talloc1)->allocBlockSize < (ulong)(va1.field_0._0_8_ << 2)) {
        pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&va1);
      }
      else {
        va0.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
        pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&va0);
        (alloc.talloc1)->ptr = pcVar47;
        sVar42 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar42;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = va0.field_0._0_8_;
        (alloc.talloc1)->cur = va1.field_0._0_8_;
        if ((ulong)va0.field_0._0_8_ < (ulong)va1.field_0._0_8_) {
          (alloc.talloc1)->cur = 0;
          va0.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
          pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&va0);
          (alloc.talloc1)->ptr = pcVar47;
          sVar42 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar42;
          (alloc.talloc1)->cur = 0;
          (alloc.talloc1)->end = va0.field_0._0_8_;
          (alloc.talloc1)->cur = va1.field_0._0_8_;
          if ((ulong)va0.field_0._0_8_ < (ulong)va1.field_0._0_8_) {
            (alloc.talloc1)->cur = 0;
            pcVar47 = (char *)0x0;
            goto LAB_00d35b43;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar42;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar50;
      pcVar47 = (alloc.talloc1)->ptr + (uVar48 - va1.field_0._0_8_);
    }
LAB_00d35b43:
    uVar48 = 7;
    if (uVar40 < 7) {
      uVar48 = uVar40;
    }
    local_17f8 = _DAT_01feba00;
    local_1808 = _DAT_01feba00;
    local_1818 = _DAT_01feb9f0;
    local_1828 = _DAT_01feb9f0;
    if (3 < uVar56) {
      lVar38 = 0;
      do {
        BVar29 = BStack_1880;
        BVar4 = BStack_18a0;
        pPVar9 = *(PrimRefMB **)((long)local_1878 + 0x20);
        vgeomID.field_0.v[0] = -1;
        vgeomID.field_0.v[1] = -1;
        vprimID.field_0.v[0] = -1;
        vprimID.field_0.v[1] = -1;
        va0.field_0._32_8_ = 0;
        va0.field_0._40_8_ = 0;
        va0.field_0._16_8_ = 0;
        va0.field_0._24_8_ = 0;
        va0.field_0._0_8_ = 0;
        va0.field_0._8_8_ = 0;
        values[0].lbounds.bounds0.upper.field_0._0_8_ = 0;
        values[0].lbounds.bounds0.upper.field_0._8_8_ = 0;
        values[0].lbounds.bounds0.lower.field_0._0_8_ = 0;
        values[0].lbounds.bounds0.lower.field_0._8_8_ = 0;
        values[0].ref.ptr = 0;
        values[0]._8_8_ = 0;
        vc0.field_0._32_8_ = 0;
        vc0.field_0._40_8_ = 0;
        vc0.field_0._16_4_ = 0;
        vc0.field_0._20_4_ = 0;
        vc0.field_0._24_4_ = 0;
        vc0.field_0._28_4_ = 0;
        vc0.field_0._0_8_ = 0;
        vc0.field_0._8_8_ = 0;
        va1.field_0._32_8_ = 0;
        va1.field_0._40_8_ = 0;
        va1.field_0._16_8_ = 0;
        va1.field_0._24_8_ = 0;
        va1.field_0._0_8_ = 0;
        va1.field_0._8_8_ = 0;
        vb1.field_0._32_8_ = 0;
        vb1.field_0._40_8_ = 0;
        vb1.field_0._16_8_ = 0;
        vb1.field_0._24_8_ = 0;
        vb1.field_0._0_8_ = 0;
        vb1.field_0._8_8_ = 0;
        vc1.field_0._32_8_ = 0;
        vc1.field_0._40_8_ = 0;
        vc1.field_0._16_8_ = 0;
        vc1.field_0._24_8_ = 0;
        vc1.field_0._0_8_ = 0;
        vc1.field_0._8_8_ = 0;
        aVar94 = _DAT_01feb9f0;
        aVar98 = _DAT_01feba00;
        aVar99 = _DAT_01feb9f0;
        aVar100 = _DAT_01feba00;
        if ((ulong)BVar49 < (ulong)BStack_18a0) {
          pRVar10 = (((this->createLeaf).bvh)->scene->geometries).items;
          local_17e8 = BStack_1880.upper;
          uVar56 = 0;
          fStack_17e4 = local_17e8;
          fStack_17e0 = local_17e8;
          fStack_17dc = local_17e8;
          do {
            fVar91 = pPVar9[(long)BVar49].lbounds.bounds0.lower.field_0.m128[3];
            fVar97 = pPVar9[(long)BVar49].lbounds.bounds0.upper.field_0.m128[3];
            pGVar11 = pRVar10[(uint)fVar91].ptr;
            fVar92 = pGVar11->fnumTimeSegments;
            fVar88 = (pGVar11->time_range).lower;
            local_1e98 = BVar29.lower;
            fVar95 = (pGVar11->time_range).lower;
            fVar96 = floorf(((local_1e98 - fVar95) / ((pGVar11->time_range).upper - fVar95)) *
                            1.0000002 * fVar92);
            fVar95 = 0.0;
            if (0.0 <= fVar96) {
              fVar95 = fVar96;
            }
            iVar35 = (int)fVar95;
            lVar12 = *(long *)&pGVar11->field_0x58;
            lVar57 = pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                     (ulong)(uint)fVar97;
            fVar60 = (pGVar11->time_range).upper - fVar88;
            fVar63 = (local_1e98 - fVar88) / fVar60;
            fVar96 = (local_17e8 - fVar88) / fVar60;
            local_17d8 = ZEXT416((uint)(fVar92 * fVar63));
            fVar61 = fVar92 * fVar96;
            fVar95 = floorf(fVar92 * fVar63);
            fVar59 = ceilf(fVar61);
            iVar36 = (int)fVar95;
            if (fVar95 <= 0.0) {
              fVar95 = 0.0;
            }
            fVar66 = fVar59;
            if (fVar92 <= fVar59) {
              fVar66 = fVar92;
            }
            if (iVar36 < 0) {
              iVar36 = -1;
            }
            uVar16 = (int)fVar92 + 1U;
            if ((int)fVar59 < (int)((int)fVar92 + 1U)) {
              uVar16 = (int)fVar59;
            }
            uVar50 = (ulong)*(uint *)(lVar12 + lVar57);
            uVar52 = (ulong)*(uint *)(lVar12 + 4 + lVar57);
            lVar13 = *(long *)&pGVar11[2].numPrimitives;
            lVar54 = (long)(int)fVar95 * 0x38;
            lVar14 = *(long *)(lVar13 + lVar54);
            lVar15 = *(long *)(lVar13 + 0x10 + lVar54);
            auVar81 = *(undefined1 (*) [16])(lVar14 + lVar15 * uVar50);
            auVar62 = *(undefined1 (*) [16])(lVar14 + lVar15 * uVar52);
            uVar51 = (ulong)*(uint *)(lVar12 + 8 + lVar57);
            auVar86 = *(undefined1 (*) [16])(lVar14 + lVar15 * uVar51);
            auVar87 = minps(auVar81,auVar62);
            auVar87 = minps(auVar87,auVar86);
            auVar81 = maxps(auVar81,auVar62);
            auVar93 = maxps(auVar81,auVar86);
            lVar55 = (long)(int)fVar66 * 0x38;
            lVar14 = *(long *)(lVar13 + lVar55);
            lVar15 = *(long *)(lVar13 + 0x10 + lVar55);
            auVar81 = *(undefined1 (*) [16])(lVar14 + lVar15 * uVar50);
            auVar62 = *(undefined1 (*) [16])(lVar14 + lVar15 * uVar52);
            auVar86 = *(undefined1 (*) [16])(lVar14 + lVar15 * uVar51);
            auVar89 = minps(auVar81,auVar62);
            auVar89 = minps(auVar89,auVar86);
            auVar81 = maxps(auVar81,auVar62);
            auVar81 = maxps(auVar81,auVar86);
            fVar95 = (float)local_17d8._0_4_ - fVar95;
            fVar74 = auVar89._0_4_;
            fVar59 = auVar87._0_4_;
            fVar70 = auVar81._0_4_;
            fVar80 = auVar81._4_4_;
            fVar83 = auVar81._8_4_;
            fVar85 = auVar81._12_4_;
            fVar78 = auVar93._0_4_;
            fVar84 = auVar93._4_4_;
            fVar64 = auVar93._8_4_;
            fVar69 = auVar93._12_4_;
            fVar67 = auVar87._4_4_;
            fVar72 = auVar87._8_4_;
            fVar73 = auVar87._12_4_;
            fVar76 = auVar89._4_4_;
            fVar77 = auVar89._8_4_;
            fVar79 = auVar89._12_4_;
            if (uVar16 - iVar36 == 1) {
              if (fVar95 <= 0.0) {
                fVar95 = 0.0;
              }
              fVar63 = 1.0 - fVar95;
              auVar62._4_4_ = fVar63 * fVar67 + fVar95 * fVar76;
              auVar62._0_4_ = fVar63 * fVar59 + fVar95 * fVar74;
              auVar71._0_4_ = fVar63 * fVar78 + fVar95 * fVar70;
              auVar71._4_4_ = fVar63 * fVar84 + fVar95 * fVar80;
              auVar71._8_4_ = fVar63 * fVar64 + fVar95 * fVar83;
              auVar71._12_4_ = fVar63 * fVar69 + fVar95 * fVar85;
              fVar96 = fVar66 - fVar61;
              if (fVar66 - fVar61 <= 0.0) {
                fVar96 = 0.0;
              }
              fVar61 = 1.0 - fVar96;
              auVar65._0_4_ = fVar74 * fVar61 + fVar59 * fVar96;
              auVar65._4_4_ = fVar76 * fVar61 + fVar67 * fVar96;
              auVar65._8_4_ = fVar77 * fVar61 + fVar72 * fVar96;
              auVar65._12_4_ = fVar79 * fVar61 + fVar73 * fVar96;
              auVar75._0_4_ = fVar61 * fVar70 + fVar96 * fVar78;
              auVar75._4_4_ = fVar61 * fVar80 + fVar96 * fVar84;
              auVar75._8_4_ = fVar61 * fVar83 + fVar96 * fVar64;
              auVar75._12_4_ = fVar61 * fVar85 + fVar96 * fVar69;
              auVar62._8_4_ = fVar63 * fVar72 + fVar95 * fVar77;
              auVar62._12_4_ = fVar63 * fVar73 + fVar95 * fVar79;
            }
            else {
              lVar14 = *(long *)(lVar13 + 0x38 + lVar54);
              lVar15 = *(long *)(lVar13 + 0x48 + lVar54);
              auVar81 = *(undefined1 (*) [16])(lVar14 + lVar15 * uVar50);
              auVar62 = *(undefined1 (*) [16])(lVar14 + lVar15 * uVar52);
              auVar86 = *(undefined1 (*) [16])(lVar14 + lVar15 * uVar51);
              auVar87 = minps(auVar81,auVar62);
              auVar93 = minps(auVar87,auVar86);
              auVar81 = maxps(auVar81,auVar62);
              auVar87 = maxps(auVar81,auVar86);
              lVar14 = *(long *)(lVar13 + -0x38 + lVar55);
              lVar15 = *(long *)(lVar13 + -0x28 + lVar55);
              auVar81 = *(undefined1 (*) [16])(lVar14 + lVar15 * uVar50);
              auVar62 = *(undefined1 (*) [16])(lVar14 + lVar15 * uVar52);
              auVar86 = *(undefined1 (*) [16])(lVar14 + lVar15 * uVar51);
              auVar89 = minps(auVar81,auVar62);
              auVar89 = minps(auVar89,auVar86);
              auVar81 = maxps(auVar81,auVar62);
              auVar81 = maxps(auVar81,auVar86);
              if (fVar95 <= 0.0) {
                fVar95 = 0.0;
              }
              fVar68 = 1.0 - fVar95;
              auVar62._0_4_ = fVar59 * fVar68 + auVar93._0_4_ * fVar95;
              auVar62._4_4_ = fVar67 * fVar68 + auVar93._4_4_ * fVar95;
              auVar62._8_4_ = fVar72 * fVar68 + auVar93._8_4_ * fVar95;
              auVar62._12_4_ = fVar73 * fVar68 + auVar93._12_4_ * fVar95;
              auVar71._0_4_ = fVar68 * fVar78 + fVar95 * auVar87._0_4_;
              auVar71._4_4_ = fVar68 * fVar84 + fVar95 * auVar87._4_4_;
              auVar71._8_4_ = fVar68 * fVar64 + fVar95 * auVar87._8_4_;
              auVar71._12_4_ = fVar68 * fVar69 + fVar95 * auVar87._12_4_;
              fVar95 = fVar66 - fVar61;
              if (fVar66 - fVar61 <= 0.0) {
                fVar95 = 0.0;
              }
              fVar59 = 1.0 - fVar95;
              auVar65._0_4_ = fVar74 * fVar59 + auVar89._0_4_ * fVar95;
              auVar65._4_4_ = fVar76 * fVar59 + auVar89._4_4_ * fVar95;
              auVar65._8_4_ = fVar77 * fVar59 + auVar89._8_4_ * fVar95;
              auVar65._12_4_ = fVar79 * fVar59 + auVar89._12_4_ * fVar95;
              auVar75._0_4_ = fVar59 * fVar70 + fVar95 * auVar81._0_4_;
              auVar75._4_4_ = fVar59 * fVar80 + fVar95 * auVar81._4_4_;
              auVar75._8_4_ = fVar59 * fVar83 + fVar95 * auVar81._8_4_;
              auVar75._12_4_ = fVar59 * fVar85 + fVar95 * auVar81._12_4_;
              uVar37 = iVar36 + 1;
              if ((int)uVar37 < (int)uVar16) {
                plVar53 = (long *)(lVar13 + (ulong)uVar37 * 0x38 + 0x10);
                do {
                  fVar78 = ((float)(int)uVar37 / fVar92 - fVar63) / (fVar96 - fVar63);
                  fVar95 = 1.0 - fVar78;
                  fVar66 = auVar65._4_4_;
                  fVar67 = auVar65._12_4_;
                  fVar84 = auVar65._8_4_;
                  fVar59 = auVar62._4_4_;
                  fVar61 = auVar62._12_4_;
                  fVar64 = auVar62._8_4_;
                  fVar76 = auVar75._4_4_;
                  fVar77 = auVar75._8_4_;
                  fVar79 = auVar75._12_4_;
                  fVar72 = auVar71._4_4_;
                  fVar73 = auVar71._8_4_;
                  fVar74 = auVar71._12_4_;
                  lVar13 = plVar53[-2];
                  lVar14 = *plVar53;
                  auVar81 = *(undefined1 (*) [16])(lVar13 + lVar14 * uVar50);
                  auVar86 = *(undefined1 (*) [16])(lVar13 + lVar14 * uVar52);
                  auVar87 = *(undefined1 (*) [16])(lVar13 + lVar14 * uVar51);
                  auVar89 = minps(auVar81,auVar86);
                  auVar89 = minps(auVar89,auVar87);
                  auVar90._0_4_ = auVar89._0_4_ - (auVar62._0_4_ * fVar95 + auVar65._0_4_ * fVar78);
                  auVar90._4_4_ = auVar89._4_4_ - (fVar59 * fVar95 + fVar66 * fVar78);
                  auVar90._8_4_ = auVar89._8_4_ - (fVar64 * fVar95 + fVar84 * fVar78);
                  auVar90._12_4_ = auVar89._12_4_ - (fVar61 * fVar95 + fVar67 * fVar78);
                  auVar81 = maxps(auVar81,auVar86);
                  auVar81 = maxps(auVar81,auVar87);
                  auVar82._0_4_ = auVar81._0_4_ - (fVar95 * auVar71._0_4_ + fVar78 * auVar75._0_4_);
                  auVar82._4_4_ = auVar81._4_4_ - (fVar95 * fVar72 + fVar78 * fVar76);
                  auVar82._8_4_ = auVar81._8_4_ - (fVar95 * fVar73 + fVar78 * fVar77);
                  auVar82._12_4_ = auVar81._12_4_ - (fVar95 * fVar74 + fVar78 * fVar79);
                  auVar86 = minps(auVar90,ZEXT816(0));
                  auVar81 = maxps(auVar82,ZEXT816(0));
                  auVar62._0_4_ = auVar62._0_4_ + auVar86._0_4_;
                  auVar62._4_4_ = fVar59 + auVar86._4_4_;
                  auVar62._8_4_ = fVar64 + auVar86._8_4_;
                  auVar62._12_4_ = fVar61 + auVar86._12_4_;
                  auVar65._0_4_ = auVar65._0_4_ + auVar86._0_4_;
                  auVar65._4_4_ = fVar66 + auVar86._4_4_;
                  auVar65._8_4_ = fVar84 + auVar86._8_4_;
                  auVar65._12_4_ = fVar67 + auVar86._12_4_;
                  auVar71._0_4_ = auVar71._0_4_ + auVar81._0_4_;
                  auVar71._4_4_ = fVar72 + auVar81._4_4_;
                  auVar71._8_4_ = fVar73 + auVar81._8_4_;
                  auVar71._12_4_ = fVar74 + auVar81._12_4_;
                  auVar75._0_4_ = auVar75._0_4_ + auVar81._0_4_;
                  auVar75._4_4_ = fVar76 + auVar81._4_4_;
                  auVar75._8_4_ = fVar77 + auVar81._8_4_;
                  auVar75._12_4_ = fVar79 + auVar81._12_4_;
                  uVar37 = uVar37 + 1;
                  plVar53 = plVar53 + 7;
                } while (uVar16 != uVar37);
              }
            }
            aVar100.m128 = (__m128)maxps(aVar100.m128,auVar75);
            aVar99.m128 = (__m128)minps(aVar99.m128,auVar65);
            aVar98.m128 = (__m128)maxps(aVar98.m128,auVar71);
            aVar94.m128 = (__m128)minps(aVar94.m128,auVar62);
            uVar50 = (ulong)*(uint *)(lVar12 + 4 + lVar57);
            lVar13 = *(long *)&pGVar11[2].numPrimitives;
            lVar14 = *(long *)(lVar13 + (long)iVar35 * 0x38);
            lVar15 = *(long *)(lVar13 + 0x10 + (long)iVar35 * 0x38);
            pfVar41 = (float *)(lVar14 + lVar15 * (ulong)*(uint *)(lVar12 + lVar57));
            fVar95 = *pfVar41;
            fVar96 = pfVar41[1];
            fVar59 = pfVar41[2];
            lVar55 = (long)(iVar35 + 1) * 0x38;
            lVar54 = *(long *)(lVar13 + lVar55);
            lVar13 = *(long *)(lVar13 + 0x10 + lVar55);
            pfVar41 = (float *)(lVar54 + (ulong)*(uint *)(lVar12 + lVar57) * lVar13);
            fVar61 = *pfVar41;
            fVar63 = pfVar41[1];
            fVar66 = pfVar41[2];
            pfVar41 = (float *)(lVar14 + lVar15 * uVar50);
            fVar67 = *pfVar41;
            fVar72 = pfVar41[1];
            fVar73 = pfVar41[2];
            pfVar41 = (float *)(lVar54 + uVar50 * lVar13);
            fVar74 = *pfVar41;
            fVar76 = pfVar41[1];
            fVar77 = pfVar41[2];
            uVar50 = (ulong)*(uint *)(lVar12 + 8 + lVar57);
            fVar79 = ((float)iVar35 * fVar60) / fVar92 + fVar88;
            fVar69 = 1.0 / ((((float)(iVar35 + 1) * fVar60) / fVar92 + fVar88) - fVar79);
            fVar80 = -fVar79 * fVar69;
            fVar64 = 1.0 - fVar80;
            fVar69 = (1.0 - fVar79) * fVar69;
            fVar70 = 1.0 - fVar69;
            pfVar41 = (float *)(lVar14 + lVar15 * uVar50);
            fVar92 = *pfVar41;
            fVar88 = pfVar41[1];
            fVar60 = pfVar41[2];
            pfVar41 = (float *)(lVar54 + lVar13 * uVar50);
            fVar79 = *pfVar41;
            fVar78 = pfVar41[1];
            fVar84 = pfVar41[2];
            *(float *)((long)&va0.field_0 + uVar56 * 4) = fVar64 * fVar95 + fVar80 * fVar61;
            *(float *)((long)&va0.field_0 + uVar56 * 4 + 0x10) = fVar64 * fVar96 + fVar80 * fVar63;
            *(float *)((long)&va0.field_0 + uVar56 * 4 + 0x20) = fVar64 * fVar59 + fVar80 * fVar66;
            *(float *)((long)&va1.field_0 + uVar56 * 4) = fVar95 * fVar70 + fVar61 * fVar69;
            *(float *)((long)&va1.field_0 + uVar56 * 4 + 0x10) = fVar96 * fVar70 + fVar63 * fVar69;
            *(float *)((long)&va1.field_0 + uVar56 * 4 + 0x20) = fVar59 * fVar70 + fVar66 * fVar69;
            *(float *)((long)&values[0].ref.ptr + uVar56 * 4) = fVar64 * fVar67 + fVar80 * fVar74;
            *(float *)((long)&values[0].lbounds.bounds0.lower.field_0 + uVar56 * 4) =
                 fVar64 * fVar72 + fVar80 * fVar76;
            *(float *)((long)&values[0].lbounds.bounds0.upper.field_0 + uVar56 * 4) =
                 fVar64 * fVar73 + fVar80 * fVar77;
            *(float *)((long)&vb1.field_0 + uVar56 * 4) = fVar67 * fVar70 + fVar74 * fVar69;
            *(float *)((long)&vb1.field_0 + uVar56 * 4 + 0x10) = fVar72 * fVar70 + fVar76 * fVar69;
            *(float *)((long)&vb1.field_0 + uVar56 * 4 + 0x20) = fVar73 * fVar70 + fVar77 * fVar69;
            *(float *)((long)&vc0.field_0 + uVar56 * 4) = fVar64 * fVar92 + fVar80 * fVar79;
            *(float *)((long)&vc0.field_0 + uVar56 * 4 + 0x10) = fVar64 * fVar88 + fVar80 * fVar78;
            *(float *)((long)&vc0.field_0 + uVar56 * 4 + 0x20) = fVar64 * fVar60 + fVar80 * fVar84;
            *(float *)((long)&vc1.field_0 + uVar56 * 4) = fVar70 * fVar92 + fVar69 * fVar79;
            *(float *)((long)&vc1.field_0 + uVar56 * 4 + 0x10) = fVar70 * fVar88 + fVar69 * fVar78;
            *(float *)((long)&vc1.field_0 + uVar56 * 4 + 0x20) = fVar70 * fVar60 + fVar69 * fVar84;
            *(float *)((long)&vgeomID.field_0 + uVar56 * 4) = fVar91;
            *(float *)((long)&vprimID.field_0 + uVar56 * 4) = fVar97;
            BVar49 = (BBox1f)((long)BVar49 + 1);
          } while ((uVar56 < 3) && (uVar56 = uVar56 + 1, (ulong)BVar49 < (ulong)BVar4));
        }
        local_1808.m128 = (__m128)maxps(local_1808.m128,aVar100.m128);
        local_1818.m128 = (__m128)minps(local_1818.m128,aVar99.m128);
        local_17f8.m128 = (__m128)maxps(local_17f8.m128,aVar98.m128);
        local_1828.m128 = (__m128)minps(local_1828.m128,aVar94.m128);
        pcVar45 = pcVar47 + lVar38 * 0x140;
        *(undefined8 *)pcVar45 = va0.field_0._0_8_;
        *(undefined8 *)(pcVar45 + 8) = va0.field_0._8_8_;
        *(undefined8 *)(pcVar45 + 0x10) = va0.field_0._16_8_;
        *(undefined8 *)(pcVar45 + 0x18) = va0.field_0._24_8_;
        *(undefined8 *)(pcVar45 + 0x20) = va0.field_0._32_8_;
        *(undefined8 *)(pcVar45 + 0x28) = va0.field_0._40_8_;
        *(size_t *)(pcVar45 + 0x30) = values[0].ref.ptr;
        pcVar45[0x38] = values[0]._8_1_;
        pcVar45[0x39] = values[0]._9_1_;
        pcVar45[0x3a] = values[0]._10_1_;
        pcVar45[0x3b] = values[0]._11_1_;
        pcVar45[0x3c] = values[0]._12_1_;
        pcVar45[0x3d] = values[0]._13_1_;
        pcVar45[0x3e] = values[0]._14_1_;
        pcVar45[0x3f] = values[0]._15_1_;
        *(undefined8 *)(pcVar45 + 0x40) = values[0].lbounds.bounds0.lower.field_0._0_8_;
        *(undefined8 *)(pcVar45 + 0x48) = values[0].lbounds.bounds0.lower.field_0._8_8_;
        *(undefined8 *)(pcVar45 + 0x50) = values[0].lbounds.bounds0.upper.field_0._0_8_;
        *(undefined8 *)(pcVar45 + 0x58) = values[0].lbounds.bounds0.upper.field_0._8_8_;
        *(undefined8 *)(pcVar45 + 0x60) = vc0.field_0._0_8_;
        *(undefined8 *)(pcVar45 + 0x68) = vc0.field_0._8_8_;
        *(ulong *)(pcVar45 + 0x70) = CONCAT44(vc0.field_0._20_4_,vc0.field_0._16_4_);
        *(ulong *)(pcVar45 + 0x78) = CONCAT44(vc0.field_0._28_4_,vc0.field_0._24_4_);
        *(undefined8 *)(pcVar45 + 0x80) = vc0.field_0._32_8_;
        *(undefined8 *)(pcVar45 + 0x88) = vc0.field_0._40_8_;
        *(float *)(pcVar45 + 0x90) = (float)va1.field_0._0_4_ - (float)va0.field_0._0_4_;
        *(float *)(pcVar45 + 0x94) = (float)va1.field_0._4_4_ - (float)va0.field_0._4_4_;
        *(float *)(pcVar45 + 0x98) = (float)va1.field_0._8_4_ - (float)va0.field_0._8_4_;
        *(float *)(pcVar45 + 0x9c) = (float)va1.field_0._12_4_ - (float)va0.field_0._12_4_;
        *(float *)(pcVar45 + 0xa0) = (float)va1.field_0._16_4_ - (float)va0.field_0._16_4_;
        *(float *)(pcVar45 + 0xa4) = (float)va1.field_0._20_4_ - (float)va0.field_0._20_4_;
        *(float *)(pcVar45 + 0xa8) = (float)va1.field_0._24_4_ - (float)va0.field_0._24_4_;
        *(float *)(pcVar45 + 0xac) = (float)va1.field_0._28_4_ - (float)va0.field_0._28_4_;
        *(float *)(pcVar45 + 0xb0) = (float)va1.field_0._32_4_ - (float)va0.field_0._32_4_;
        *(float *)(pcVar45 + 0xb4) = (float)va1.field_0._36_4_ - (float)va0.field_0._36_4_;
        *(float *)(pcVar45 + 0xb8) = (float)va1.field_0._40_4_ - (float)va0.field_0._40_4_;
        *(float *)(pcVar45 + 0xbc) = (float)va1.field_0._44_4_ - (float)va0.field_0._44_4_;
        *(float *)(pcVar45 + 0xc0) = (float)vb1.field_0._0_4_ - (float)values[0].ref.ptr;
        *(float *)(pcVar45 + 0xc4) = (float)vb1.field_0._4_4_ - values[0].ref.ptr._4_4_;
        *(float *)(pcVar45 + 200) = (float)vb1.field_0._8_4_ - (float)values[0]._8_4_;
        *(float *)(pcVar45 + 0xcc) = (float)vb1.field_0._12_4_ - (float)values[0]._12_4_;
        *(float *)(pcVar45 + 0xd0) =
             (float)vb1.field_0._16_4_ - (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
        *(float *)(pcVar45 + 0xd4) =
             (float)vb1.field_0._20_4_ - (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
        *(float *)(pcVar45 + 0xd8) =
             (float)vb1.field_0._24_4_ - (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
        *(float *)(pcVar45 + 0xdc) =
             (float)vb1.field_0._28_4_ - (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
        *(float *)(pcVar45 + 0xe0) =
             (float)vb1.field_0._32_4_ - (float)values[0].lbounds.bounds0.upper.field_0._0_4_;
        *(float *)(pcVar45 + 0xe4) =
             (float)vb1.field_0._36_4_ - (float)values[0].lbounds.bounds0.upper.field_0._4_4_;
        *(float *)(pcVar45 + 0xe8) =
             (float)vb1.field_0._40_4_ - (float)values[0].lbounds.bounds0.upper.field_0._8_4_;
        *(float *)(pcVar45 + 0xec) =
             (float)vb1.field_0._44_4_ - (float)values[0].lbounds.bounds0.upper.field_0._12_4_;
        *(float *)(pcVar45 + 0xf0) = (float)vc1.field_0._0_4_ - (float)vc0.field_0._0_4_;
        *(float *)(pcVar45 + 0xf4) = (float)vc1.field_0._4_4_ - (float)vc0.field_0._4_4_;
        *(float *)(pcVar45 + 0xf8) = (float)vc1.field_0._8_4_ - (float)vc0.field_0._8_4_;
        *(float *)(pcVar45 + 0xfc) = (float)vc1.field_0._12_4_ - (float)vc0.field_0._12_4_;
        *(float *)(pcVar45 + 0x100) = (float)vc1.field_0._16_4_ - (float)vc0.field_0._16_4_;
        *(float *)(pcVar45 + 0x104) = (float)vc1.field_0._20_4_ - (float)vc0.field_0._20_4_;
        *(float *)(pcVar45 + 0x108) = (float)vc1.field_0._24_4_ - (float)vc0.field_0._24_4_;
        *(float *)(pcVar45 + 0x10c) = (float)vc1.field_0._28_4_ - (float)vc0.field_0._28_4_;
        *(float *)(pcVar45 + 0x110) = (float)vc1.field_0._32_4_ - (float)vc0.field_0._32_4_;
        *(float *)(pcVar45 + 0x114) = (float)vc1.field_0._36_4_ - (float)vc0.field_0._36_4_;
        *(float *)(pcVar45 + 0x118) = (float)vc1.field_0._40_4_ - (float)vc0.field_0._40_4_;
        *(float *)(pcVar45 + 0x11c) = (float)vc1.field_0._44_4_ - (float)vc0.field_0._44_4_;
        *(longlong *)(pcVar45 + 0x120) = vgeomID.field_0.v[0];
        *(longlong *)(pcVar45 + 0x128) = vgeomID.field_0.v[1];
        *(longlong *)(pcVar45 + 0x130) = vprimID.field_0.v[0];
        *(longlong *)(pcVar45 + 0x138) = vprimID.field_0.v[1];
        lVar38 = lVar38 + 1;
      } while (lVar38 != uVar40 + (uVar40 == 0));
    }
    (__return_storage_ptr__->ref).ptr = uVar48 | (ulong)pcVar47 | 8;
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1828;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_17f8;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1818;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1808;
    __return_storage_ptr__->dt = BStack_1880;
    return __return_storage_ptr__;
  }
  lVar38 = 0xbc;
  do {
    *(undefined8 *)(local_17d8 + lVar38 + 4) = 0xffffffff7f800000;
    *(undefined8 *)(local_17d8 + lVar38 + 0xc) = 0;
    lVar38 = lVar38 + 0xf0;
  } while (lVar38 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  va0.field_0._0_8_ = uVar40;
  va0.field_0._16_8_ = uVar17;
  va0.field_0._24_8_ = uVar18;
  va0.field_0._32_8_ = uVar19;
  va0.field_0._40_8_ = uVar20;
  local_1798._0_4_ = local_1ed8._0_4_;
  local_1798._4_4_ = local_1ed8._4_4_;
  local_1798._8_4_ = local_1ed8._8_4_;
  local_1798._12_4_ = local_1ed8._12_4_;
  local_1788.m128[0] = local_1e98;
  local_1788.m128[1] = fStack_1e94;
  local_1788.m128[2] = fStack_1e90;
  local_1788.m128[3] = fStack_1e8c;
  local_1778.m128[0] = local_1ea8;
  local_1778.m128[1] = fStack_1ea4;
  local_1778.m128[2] = fStack_1ea0;
  local_1778.m128[3] = fStack_1e9c;
  local_1768._0_8_ = uVar27;
  local_1768._8_8_ = uVar28;
  local_1758[0] = BVar49;
  local_1758[1] = BVar29;
  local_1748[0] = values[0].ref.ptr;
  local_1748[1] = values[0]._8_8_;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  fStack_172c = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar4;
  uStack_1710 = va0.field_0._8_8_;
  local_840 = BVar4;
  local_838[0].lower = 2.8026e-45;
  local_838[0].upper = 0.0;
  local_8c8[0] = &local_840;
  pHVar1 = &this->heuristicTemporalSplit;
  local_1e68._8_8_ = 0x7f8000007f800000;
  local_1e68._0_8_ = 0x7f8000007f800000;
  local_1e78._8_8_ = 0xff800000ff800000;
  local_1e78._0_8_ = 0xff800000ff800000;
  bVar31 = false;
  this_01 = this;
  do {
    if (local_848 == 0) {
      uVar56 = 0xffffffffffffffff;
    }
    else {
      uVar56 = 0xffffffffffffffff;
      pBVar46 = local_1758;
      uVar48 = 0;
      uVar50 = 0;
      do {
        uVar52 = (long)pBVar46[1] - (long)*pBVar46;
        if ((((this->cfg).maxLeafSize < uVar52) || (1 < (uint)pBVar46[9].upper)) || (bVar30)) {
          if (uVar48 < uVar52) {
            uVar56 = uVar50;
            uVar48 = uVar52;
          }
          bVar30 = false;
        }
        uVar50 = uVar50 + 1;
        pBVar46 = pBVar46 + 0x1e;
      } while (local_848 != uVar50);
    }
    if (uVar56 != 0xffffffffffffffff) {
      vc0.field_0._0_8_ = uVar40 + 1;
      va1.field_0._0_8_ = vc0.field_0._0_8_;
      iVar35 = *(int *)((long)local_1708 + uVar56 * 0xf0 + -4);
      if (iVar35 == 0) {
        local_1c48 = local_1758[uVar56 * 0x1e];
        BStack_1b30 = local_1758[uVar56 * 0x1e + 1];
        vb1.field_0._0_8_ = 0x7f8000007f800000;
        vb1.field_0._8_8_ = 0x7f8000007f800000;
        vb1.field_0._16_8_ = 0xff800000ff800000;
        vb1.field_0._24_8_ = 0xff800000ff800000;
        vb1.field_0._32_8_ = 0x7f8000007f800000;
        vb1.field_0._40_8_ = 0x7f8000007f800000;
        local_1d58._0_8_ = 0xff800000ff800000;
        local_1d58._8_8_ = 0xff800000ff800000;
        local_1d48.m128[0] = INFINITY;
        local_1d48.m128[1] = INFINITY;
        local_1d48._8_8_ = 0x7f8000007f800000;
        local_1d38._0_8_ = 0xff800000ff800000;
        local_1d38.m128[2] = -INFINITY;
        local_1d38.m128[3] = -INFINITY;
        local_1d08 = 0.0;
        local_1d28.lower = 0.0;
        local_1d28.upper = 0.0;
        BStack_1d20.lower = 0.0;
        BStack_1d20.upper = 0.0;
        fStack_1d04 = 1.0;
        fStack_1d00 = 1.0;
        fStack_1cfc = 0.0;
        vc1.field_0._0_8_ = 0x7f8000007f800000;
        vc1.field_0._8_8_ = 0x7f8000007f800000;
        vc1.field_0._16_8_ = 0xff800000ff800000;
        vc1.field_0._24_8_ = 0xff800000ff800000;
        vc1.field_0._32_8_ = 0x7f8000007f800000;
        vc1.field_0._40_8_ = 0x7f8000007f800000;
        vprimID.field_0.i[1] = *(undefined4 *)(local_1708 + uVar56 * 0x1e + -1);
        vprimID.field_0.i[0] = vprimID.field_0.i[1];
        vprimID.field_0.i[3] = vprimID.field_0.i[1];
        vprimID.field_0.i[2] = vprimID.field_0.i[1];
        lVar38 = (long)(1 << (*(byte *)((long)&local_1718 + uVar56 * 0xf0 + 4) & 0x1f)) * 0x10;
        vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar38);
        vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar38 + 8);
        vgeomID.field_0.v[0] = (longlong)(&local_1718 + uVar56 * 0x1e);
        vgeomID.field_0.v[1] = (longlong)&vprimID;
        BStack_1c40 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                        (*(PrimRefMB **)((long)local_1728[uVar56 * 0x1e] + 0x20),
                                         (size_t)local_1c48,(size_t)BStack_1b30,
                                         (EmptyTy *)local_1a38,
                                         (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vb1,
                                         (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vc1,
                                         (anon_class_24_3_c5d13451 *)&vgeomID,&reduction,&reduction2
                                         ,0x80,0xc00);
        local_1c18 = local_1728[uVar56 * 0x1e];
        BVar4 = local_1728[uVar56 * 0x1e + -1];
        local_1c78._8_8_ = 0xff800000ff800000;
        local_1c78._0_8_ = 0xff800000ff800000;
        vc0.field_0._16_4_ = (undefined4)vb1.field_0._0_8_;
        vc0.field_0._20_4_ = (undefined4)((ulong)vb1.field_0._0_8_ >> 0x20);
        vc0.field_0._24_4_ = (undefined4)vb1.field_0._8_8_;
        vc0.field_0._28_4_ = (undefined4)((ulong)vb1.field_0._8_8_ >> 0x20);
        vc0.field_0._32_8_ = vb1.field_0._16_8_;
        vc0.field_0._40_8_ = vb1.field_0._24_8_;
        local_1c88._0_8_ = vb1.field_0._32_8_;
        local_1c88._8_8_ = vb1.field_0._40_8_;
        local_1c68.lower = INFINITY;
        local_1c68.upper = INFINITY;
        acStack_1c60[0] = '\0';
        acStack_1c60[1] = '\0';
        acStack_1c60[2] = -0x80;
        acStack_1c60[3] = '\x7f';
        acStack_1c60[4] = '\0';
        acStack_1c60[5] = '\0';
        acStack_1c60[6] = -0x80;
        acStack_1c60[7] = '\x7f';
        acStack_1c60[8] = '\0';
        acStack_1c60[9] = '\0';
        acStack_1c60[10] = -0x80;
        acStack_1c60[0xb] = -1;
        acStack_1c60[0xc] = '\0';
        acStack_1c60[0xd] = '\0';
        acStack_1c60[0xe] = -0x80;
        acStack_1c60[0xf] = -1;
        BStack_1c50.lower = -INFINITY;
        BStack_1c50.upper = -INFINITY;
        fVar88 = BVar4.lower;
        fVar92 = fVar88;
        if (fVar88 <= BStack_1c20.lower) {
          fVar92 = BStack_1c20.lower;
        }
        fVar91 = BVar4.upper;
        if (fVar91 <= BStack_1c20.upper) {
          BStack_1c20.upper = fVar91;
        }
        BStack_1c20.lower = fVar92;
        va1.field_0._16_8_ = vc1.field_0._0_8_;
        va1.field_0._24_8_ = vc1.field_0._8_8_;
        va1.field_0._32_8_ = vc1.field_0._16_8_;
        va1.field_0._40_8_ = vc1.field_0._24_8_;
        local_1b78 = vc1.field_0._32_8_;
        aStack_1b70._0_8_ = vc1.field_0._40_8_;
        aStack_1b70._8_8_ = 0xff800000ff800000;
        uStack_1b60 = 0xff800000ff800000;
        local_1b58 = 0x7f8000007f800000;
        sStack_1b50 = 0x7f8000007f800000;
        local_1b48 = 0xff800000ff800000;
        BStack_1b40.lower = -INFINITY;
        BStack_1b40.upper = -INFINITY;
        if (fVar88 <= BStack_1b10.lower) {
          BVar4 = (BBox1f)((ulong)BStack_1b10 & 0xffffffff);
        }
        if (fVar91 <= BStack_1b10.upper) {
          BStack_1b10.upper = fVar91;
        }
        BStack_1b10.lower = BVar4.lower;
        this = this_01;
        local_1b38 = BStack_1c40;
        local_1b08 = local_1c18;
LAB_00d34390:
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
        this_01 = this;
      }
      else {
        this_00 = &(&va0)[uVar56 * 5].field_0.field_0.y;
        if (iVar35 != 2) {
          if (iVar35 == 1) {
            SetMB::deterministic_order((SetMB *)this_00);
            splitFallback(this_01,(SetMB *)this_00,(SetMB *)&vc0.field_0.field_0.y,
                          (SetMB *)&va1.field_0.field_0.y);
            this = this_01;
          }
          else {
            this = this_01;
            if (iVar35 == 3) {
              SetMB::deterministic_order((SetMB *)this_00);
              splitByGeometry(this_01,(SetMB *)this_00,(SetMB *)&vc0.field_0.field_0.y,
                              (SetMB *)&va1.field_0.field_0.y);
              this = this_01;
            }
          }
          goto LAB_00d34390;
        }
        time_range1.lower = *(float *)(local_1708 + uVar56 * 0x1e + -1);
        time_range0.lower = local_1728[uVar56 * 0x1e + -1].lower;
        time_range1.upper = local_1728[uVar56 * 0x1e + -1].upper;
        local_1b08 = local_1728[uVar56 * 0x1e];
        time_range0.upper = time_range1.lower;
        local_1c18 = (BBox1f)operator_new(0x28);
        pMVar5 = pHVar1->device;
        BVar4 = local_1758[uVar56 * 0x1e + 1];
        *(MemoryMonitorInterface **)local_1c18 = pMVar5;
        *(undefined1 *)((long)local_1c18 + 8) = 0;
        *(long *)((long)local_1c18 + 0x10) = 0;
        *(long *)((long)local_1c18 + 0x18) = 0;
        *(long *)((long)local_1c18 + 0x20) = 0;
        lVar38 = (long)BVar4 - (long)local_1758[uVar56 * 0x1e];
        this = this_01;
        if (lVar38 != 0) {
          uVar48 = lVar38 * 0x50;
          (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,uVar48,0);
          if (uVar48 < 0x1c00000) {
            pvVar39 = alignedMalloc(uVar48,0x10);
          }
          else {
            pvVar39 = os_malloc(uVar48,(bool *)((long)local_1c18 + 8));
          }
          *(void **)((long)local_1c18 + 0x20) = pvVar39;
          *(long *)((long)local_1c18 + 0x10) = lVar38;
          *(long *)((long)local_1c18 + 0x18) = lVar38;
          this = this_01;
        }
        uVar17 = vgeomID.field_0.v[1];
        vSplitMask.field_0._0_4_ = local_1b08.lower;
        vSplitMask.field_0._4_4_ = local_1b08.upper;
        vSplitMask.field_0._8_8_ = &time_range0;
        BVar4 = local_1758[uVar56 * 0x1e];
        BVar49 = local_1758[uVar56 * 0x1e + 1];
        vc1.field_0._0_8_ = 0x7f8000007f800000;
        vc1.field_0._8_8_ = 0x7f8000007f800000;
        vc1.field_0._16_8_ = 0xff800000ff800000;
        vc1.field_0._24_8_ = 0xff800000ff800000;
        vc1.field_0._32_8_ = 0x7f8000007f800000;
        vc1.field_0._40_8_ = 0x7f8000007f800000;
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
                )local_1c18;
        if ((ulong)((long)BVar49 - (long)BVar4) < 0xc00) {
          vgeomID.field_0.v[0] = (longlong)BVar4;
          vgeomID.field_0.v[1] = (longlong)BVar49;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    ((PrimInfoMB *)&vb1,(anon_class_40_5_808acc65 *)&vSplitMask,
                     (range<unsigned_long> *)&vgeomID);
        }
        else {
          vgeomID.field_0.v[1]._4_1_ = 1;
          vgeomID.field_0.v[1]._6_2_ = SUB82(uVar17,6);
          vgeomID.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vgeomID);
          _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          vprimID.field_0.v[0] = (longlong)BVar49;
          vprimID.field_0.v[1] = (longlong)BVar4;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMB *)&vb1,(d1 *)&vprimID,(blocked_range<unsigned_long> *)&vc1,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                     (anon_class_16_2_ed117de8_conflict29 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vgeomID,(task_group_context *)this);
          cVar34 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vgeomID);
          if (cVar34 != '\0') {
            prVar44 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar44,"task cancelled");
            __cxa_throw(prVar44,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&vgeomID);
        }
        if ((long)BStack_1d20 - (long)local_1d28 !=
            (long)local_1758[uVar56 * 0x1e + 1] - (long)local_1758[uVar56 * 0x1e]) {
          vc1.field_0._0_8_ = &time_range0;
          BStack_1d20 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                          (*(PrimRefMB **)((long)local_1c18 + 0x20),0,
                                           (long)local_1758[uVar56 * 0x1e + 1] -
                                           (long)local_1758[uVar56 * 0x1e],0x400,
                                           (anon_class_8_1_41ce32a5 *)&vc1);
        }
        uVar17 = vprimID.field_0.v[1];
        vc0.field_0._16_4_ = (undefined4)vb1.field_0._0_8_;
        vc0.field_0._20_4_ = (undefined4)((ulong)vb1.field_0._0_8_ >> 0x20);
        vc0.field_0._24_4_ = (undefined4)vb1.field_0._8_8_;
        vc0.field_0._28_4_ = (undefined4)((ulong)vb1.field_0._8_8_ >> 0x20);
        vc0.field_0._32_8_ = vb1.field_0._16_8_;
        vc0.field_0._40_8_ = vb1.field_0._24_8_;
        local_1c88._0_8_ = vb1.field_0._32_8_;
        local_1c88._8_8_ = vb1.field_0._40_8_;
        local_1c78._8_8_ = local_1d58._8_8_;
        local_1c78._0_8_ = local_1d58._0_8_;
        local_1c68.lower = local_1d48.m128[0];
        local_1c68.upper = local_1d48.m128[1];
        acStack_1c60[0] = local_1d48._8_1_;
        acStack_1c60[1] = local_1d48._9_1_;
        acStack_1c60[2] = local_1d48._10_1_;
        acStack_1c60[3] = local_1d48._11_1_;
        acStack_1c60[4] = local_1d48._12_1_;
        acStack_1c60[5] = local_1d48._13_1_;
        acStack_1c60[6] = local_1d48._14_1_;
        acStack_1c60[7] = local_1d48._15_1_;
        acStack_1c60[8] = local_1d38._0_1_;
        acStack_1c60[9] = local_1d38._1_1_;
        acStack_1c60[10] = local_1d38._2_1_;
        acStack_1c60[0xb] = local_1d38._3_1_;
        acStack_1c60[0xc] = local_1d38._4_1_;
        acStack_1c60[0xd] = local_1d38._5_1_;
        acStack_1c60[0xe] = local_1d38._6_1_;
        acStack_1c60[0xf] = local_1d38._7_1_;
        BStack_1c50.lower = local_1d38.m128[2];
        BStack_1c50.upper = local_1d38.m128[3];
        local_1c48 = local_1d28;
        BStack_1c40 = BStack_1d20;
        local_1c28.upper = fStack_1d04;
        local_1c28.lower = local_1d08;
        BStack_1c20 = (BBox1f)(CONCAT44(~-(uint)(fStack_1cfc < time_range0.upper) &
                                        (uint)time_range0.upper,
                                        ~-(uint)(fStack_1d00 < time_range0.lower) &
                                        (uint)fStack_1d00) |
                              CONCAT44((uint)fStack_1cfc & -(uint)(fStack_1cfc < time_range0.upper),
                                       (uint)time_range0.lower &
                                       -(uint)(fStack_1d00 < time_range0.lower)));
        BVar4 = local_1758[uVar56 * 0x1e + 1];
        vgeomID.field_0.v[0] = 0x7f8000007f800000;
        vgeomID.field_0.v[1] = 0x7f8000007f800000;
        _reduction2 = local_1b08;
        if ((ulong)((long)BVar4 - (long)local_1758[uVar56 * 0x1e]) < 0xc00) {
          vprimID.field_0.v[0] = (longlong)local_1758[uVar56 * 0x1e];
          vprimID.field_0.v[1] = (longlong)BVar4;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    ((PrimInfoMB *)&vc1,(anon_class_24_3_35f68c7c *)&reduction2,
                     (range<unsigned_long> *)&vprimID);
        }
        else {
          vprimID.field_0.v[1]._4_1_ = 1;
          vprimID.field_0.v[1]._6_2_ = SUB82(uVar17,6);
          vprimID.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vprimID);
          local_1a38._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_1a38._8_8_ = &reduction2;
          _reduction = (code *)BVar4;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vc1,(d1 *)&reduction,
                     (blocked_range<unsigned_long> *)&vgeomID,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1a38,
                     (anon_class_16_2_ed117de8_conflict30 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vprimID,(task_group_context *)this);
          cVar34 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vprimID);
          if (cVar34 != '\0') {
            prVar44 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar44,"task cancelled");
            __cxa_throw(prVar44,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&vprimID);
        }
        local_1b38 = local_1758[uVar56 * 0x1e];
        this_01 = this;
        BStack_1db0 = local_1b38;
        if (local_1758[uVar56 * 0x1e + 1] != local_1b38) {
          vgeomID.field_0.v[0] = (longlong)&time_range1;
          BStack_1db0 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                                          (*(PrimRefMB **)((long)local_1b08 + 0x20),
                                           (unsigned_long)local_1b38,
                                           (unsigned_long)local_1758[uVar56 * 0x1e + 1],0x400,
                                           (anon_class_8_1_41ce32a6 *)&vgeomID);
        }
        va1.field_0._16_8_ = vc1.field_0._0_8_;
        va1.field_0._24_8_ = vc1.field_0._8_8_;
        va1.field_0._32_8_ = vc1.field_0._16_8_;
        va1.field_0._40_8_ = vc1.field_0._24_8_;
        local_1b78 = vc1.field_0._32_8_;
        aStack_1b70._0_8_ = vc1.field_0._40_8_;
        aStack_1b70._8_8_ = 0xff800000ff800000;
        uStack_1b60 = 0xff800000ff800000;
        local_1b58 = 0x7f8000007f800000;
        sStack_1b50 = 0x7f8000007f800000;
        local_1b48 = 0xff800000ff800000;
        BStack_1b40.lower = -INFINITY;
        BStack_1b40.upper = -INFINITY;
        BStack_1b30 = BStack_1db0;
        local_1b18.lower = 0.0;
        local_1b18.upper = 1.0;
        BStack_1b10 = (BBox1f)(CONCAT44(~-(uint)(0.0 < time_range1.upper) & (uint)time_range1.upper,
                                        ~-(uint)(1.0 < time_range1.lower)) & 0xffffffff3f800000 |
                              (ulong)((uint)time_range1.lower & -(uint)(1.0 < time_range1.lower)));
      }
      bVar58 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      findFallback((Split *)&vb1,this,(SetMB *)&vc0.field_0.field_0.y);
      uVar23 = vb1.field_0._40_8_;
      uVar21 = vb1.field_0._32_8_;
      uVar19 = vb1.field_0._16_8_;
      uVar18 = vb1.field_0._8_8_;
      uVar17 = vb1.field_0._0_8_;
      findFallback((Split *)&vb1,this,(SetMB *)&va1.field_0.field_0.y);
      lVar38 = local_640;
      uVar24 = vb1.field_0._40_8_;
      uVar22 = vb1.field_0._32_8_;
      uVar20 = vb1.field_0._16_8_;
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
      pBVar46 = local_8c8[uVar56];
      if (local_1c18 == *pBVar46) {
        pBVar46[1] = (BBox1f)((long)pBVar46[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar38 * 2 + -1] = local_1c18;
        local_838[lVar38 * 2].lower = 1.4013e-45;
        local_838[lVar38 * 2].upper = 0.0;
        local_8c8[uVar56] = local_838 + lVar38 * 2 + -1;
      }
      lVar38 = local_640;
      if (local_1b08 == *pBVar46) {
        local_8c8[local_848] = pBVar46;
        pBVar46[1] = (BBox1f)((long)pBVar46[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar38 * 2 + -1] = local_1b08;
        local_838[lVar38 * 2].lower = 1.4013e-45;
        local_838[lVar38 * 2].upper = 0.0;
        local_8c8[local_848] = local_838 + lVar38 * 2 + -1;
      }
      pBVar8 = pBVar46 + 1;
      *pBVar8 = (BBox1f)((long)*pBVar8 + -1);
      if ((*pBVar8 == (BBox1f)0x0) && (BVar4 = *pBVar46, BVar4 != (BBox1f)0x0)) {
        lVar38 = *(undefined8 *)((long)BVar4 + 0x18);
        pvVar39 = *(void **)((long)BVar4 + 0x20);
        this = this_01;
        if (pvVar39 != (void *)0x0) {
          if ((ulong)(lVar38 * 0x50) < 0x1c00000) {
            alignedFree(pvVar39);
            this = this_01;
          }
          else {
            os_free(pvVar39,lVar38 * 0x50,*(bool *)((long)BVar4 + 8));
            this = this_01;
          }
        }
        if (lVar38 != 0) {
          (**(code **)**(undefined8 **)BVar4)(*(undefined8 **)BVar4,lVar38 * -0x50,1);
        }
        *(undefined8 *)((long)BVar4 + 0x10) = 0;
        *(undefined8 *)((long)BVar4 + 0x18) = 0;
        *(undefined8 *)((long)BVar4 + 0x20) = 0;
        operator_delete((void *)BVar4);
        this_01 = this;
      }
      uVar48 = local_848;
      *(undefined8 *)&(&va0)[uVar56 * 5].field_0 = vc0.field_0._0_8_;
      *(ulong *)((long)&(&va0)[uVar56 * 5].field_0 + 0x10) =
           CONCAT44(vc0.field_0._20_4_,vc0.field_0._16_4_);
      *(ulong *)((long)&(&va0)[uVar56 * 5].field_0 + 0x18) =
           CONCAT44(vc0.field_0._28_4_,vc0.field_0._24_4_);
      *(undefined8 *)((long)&(&va0)[uVar56 * 5].field_0 + 0x20) = vc0.field_0._32_8_;
      *(undefined8 *)((long)&(&va0)[uVar56 * 5].field_0 + 0x28) = vc0.field_0._40_8_;
      ((BBox1f *)(local_1798 + uVar56 * 0xf0))->lower = (float)local_1c88._0_4_;
      ((BBox1f *)(local_1798 + uVar56 * 0xf0))->upper = local_1c88.m128[1];
      ((BBox1f *)(local_1798 + uVar56 * 0xf0 + 8))->lower = (float)local_1c88._8_4_;
      ((BBox1f *)(local_1798 + uVar56 * 0xf0 + 8))->upper = local_1c88.m128[3];
      *(undefined8 *)(local_1788.m128 + uVar56 * 0x3c) = local_1c78._0_8_;
      *(undefined8 *)((long)&local_1788 + uVar56 * 0xf0 + 8) = local_1c78._8_8_;
      *(BBox1f *)(local_1778.m128 + uVar56 * 0x3c) = local_1c68;
      *(undefined8 *)((long)&local_1778 + uVar56 * 0xf0 + 8) = acStack_1c60._0_8_;
      *(undefined8 *)(&local_1768 + uVar56 * 0xf) = acStack_1c60._8_8_;
      local_1758[uVar56 * 0x1e + -1] = BStack_1c50;
      local_1758[uVar56 * 0x1e] = local_1c48;
      local_1758[uVar56 * 0x1e + 1] = BStack_1c40;
      local_1748[uVar56 * 0x1e] = local_1c38;
      local_1748[uVar56 * 0x1e + 1] = sStack_1c30;
      (&local_1738)[uVar56 * 0x1e] = local_1c28;
      local_1728[uVar56 * 0x1e + -1] = BStack_1c20;
      *(BBox1f *)&local_1728[uVar56 * 0x1e].lower = local_1c18;
      (&local_1718)[uVar56 * 0x1e] = uVar17;
      local_1708[uVar56 * 0x1e + -1] = uVar18;
      local_1708[uVar56 * 0x1e] = uVar19;
      local_1708[uVar56 * 0x1e + 2] = uVar21;
      local_1708[uVar56 * 0x1e + 3] = uVar23;
      local_1708[uVar56 * 0x1e + 4] = local_1d58._0_8_;
      local_1708[uVar56 * 0x1e + 5] = local_1d58._8_8_;
      *(undefined8 *)&(&va0)[local_848 * 5].field_0 = va1.field_0._0_8_;
      *(undefined8 *)((long)&(&va0)[uVar48 * 5].field_0 + 0x10) = va1.field_0._16_8_;
      *(undefined8 *)((long)&(&va0)[uVar48 * 5].field_0 + 0x18) = va1.field_0._24_8_;
      *(undefined8 *)((long)&(&va0)[uVar48 * 5].field_0 + 0x20) = va1.field_0._32_8_;
      *(undefined8 *)((long)&(&va0)[uVar48 * 5].field_0 + 0x28) = va1.field_0._40_8_;
      *(undefined8 *)(local_1798 + uVar48 * 0xf0) = local_1b78;
      *(undefined8 *)(local_1798 + uVar48 * 0xf0 + 8) = aStack_1b70._0_8_;
      *(undefined8 *)(local_1788.m128 + uVar48 * 0x3c) = aStack_1b70._8_8_;
      *(unsigned_long *)((long)&local_1788 + uVar48 * 0xf0 + 8) = uStack_1b60;
      *(unsigned_long *)(local_1778.m128 + uVar48 * 0x3c) = local_1b58;
      *(size_t *)((long)&local_1778 + uVar48 * 0xf0 + 8) = sStack_1b50;
      *(size_t *)(&local_1768 + uVar48 * 0xf) = local_1b48;
      local_1758[uVar48 * 0x1e + -1] = BStack_1b40;
      local_1758[uVar48 * 0x1e] = local_1b38;
      local_1758[uVar48 * 0x1e + 1] = BStack_1b30;
      local_1748[uVar48 * 0x1e] = local_1b28;
      local_1748[uVar48 * 0x1e + 1] = sStack_1b20;
      (&local_1738)[uVar48 * 0x1e] = local_1b18;
      local_1728[uVar48 * 0x1e + -1] = BStack_1b10;
      local_1728[uVar48 * 0x1e] = local_1b08;
      (&local_1718)[uVar48 * 0x1e] = 0xffffffff7f800000;
      local_1708[uVar48 * 0x1e + -1] = 0;
      local_1708[uVar48 * 0x1e] = uVar20;
      local_1708[uVar48 * 0x1e + 2] = uVar22;
      local_1708[uVar48 * 0x1e + 3] = uVar24;
      local_1708[uVar48 * 0x1e + 4] = local_1d58._0_8_;
      local_1708[uVar48 * 0x1e + 5] = local_1d58._8_8_;
      local_848 = local_848 + 1;
      if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&new_vector,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)new_vector._M_t.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl);
      }
      bVar31 = (bool)(bVar31 | bVar58);
    }
    aVar32 = local_1c78;
  } while ((uVar56 != 0xffffffffffffffff) && (local_848 < (this->cfg).branchingFactor));
  if (local_848 != 0) {
    pfVar41 = &fStack_172c;
    uVar40 = local_848;
    do {
      bVar31 = (bool)(bVar31 | (*pfVar41 < (in->prims).super_PrimInfoMB.time_range.upper ||
                               (in->prims).super_PrimInfoMB.time_range.lower < pfVar41[-1]));
      pfVar41 = pfVar41 + 0x3c;
      uVar40 = uVar40 - 1;
    } while (uVar40 != 0);
  }
  if (!bVar31) {
    vc1.field_0._0_8_ = 0xe0;
    pTVar6 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar6->alloc)._M_b._M_p) {
      va1.field_0._8_1_ = 1;
      va1.field_0._0_8_ = pTVar6;
      MutexSys::lock(&pTVar6->mutex);
      if ((pTVar6->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar6->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar6->alloc1).bytesUsed + (pTVar6->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar6->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar6->alloc0).end + (pTVar6->alloc1).end) -
             ((pTVar6->alloc0).cur + (pTVar6->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar6->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar6->alloc1).bytesWasted + (pTVar6->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar6->alloc0).bytesUsed = 0;
      (pTVar6->alloc0).bytesWasted = 0;
      (pTVar6->alloc0).end = 0;
      (pTVar6->alloc0).allocBlockSize = 0;
      (pTVar6->alloc0).ptr = (char *)0x0;
      (pTVar6->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar6->alloc1).bytesUsed = 0;
        (pTVar6->alloc1).bytesWasted = 0;
        (pTVar6->alloc1).end = 0;
        (pTVar6->alloc1).allocBlockSize = 0;
        (pTVar6->alloc1).ptr = (char *)0x0;
        (pTVar6->alloc1).cur = 0;
      }
      else {
        (pTVar6->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar6->alloc1).ptr = (char *)0x0;
        (pTVar6->alloc1).cur = 0;
        (pTVar6->alloc1).end = 0;
        (pTVar6->alloc1).allocBlockSize = 0;
        (pTVar6->alloc1).bytesUsed = 0;
        (pTVar6->alloc1).bytesWasted = 0;
        (pTVar6->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar6->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      vc0.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      vc0.field_0._8_1_ = 1;
      vb1.field_0._0_8_ = pTVar6;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar7._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar7,(ThreadLocal2 **)&vb1);
      }
      else {
        *iVar7._M_current = (ThreadLocal2 *)vb1.field_0._0_8_;
        pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar3 = *pppTVar3 + 1;
      }
      if (vc0.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)vc0.field_0._0_8_);
      }
      if (va1.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)va1.field_0._0_8_);
      }
    }
    (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + vc1.field_0._0_8_;
    sVar42 = (alloc.talloc0)->cur;
    uVar40 = (ulong)(-(int)sVar42 & 0xf);
    uVar56 = sVar42 + vc1.field_0._0_8_ + uVar40;
    (alloc.talloc0)->cur = uVar56;
    if ((alloc.talloc0)->end < uVar56) {
      (alloc.talloc0)->cur = sVar42;
      if ((alloc.talloc0)->allocBlockSize < (ulong)(vc1.field_0._0_8_ << 2)) {
        pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc1);
      }
      else {
        vc0.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc0);
        (alloc.talloc0)->ptr = pcVar47;
        sVar42 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar42;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = vc0.field_0._0_8_;
        (alloc.talloc0)->cur = vc1.field_0._0_8_;
        this = this_01;
        if ((ulong)vc0.field_0._0_8_ < (ulong)vc1.field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          vc0.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc0);
          (alloc.talloc0)->ptr = pcVar47;
          sVar42 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar42;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = vc0.field_0._0_8_;
          (alloc.talloc0)->cur = vc1.field_0._0_8_;
          if ((ulong)vc0.field_0._0_8_ < (ulong)vc1.field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar47 = (char *)0x0;
            this_01 = this;
            goto LAB_00d354e0;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar42;
        this_01 = this;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar40;
      pcVar47 = (alloc.talloc0)->ptr + (uVar56 - vc1.field_0._0_8_);
    }
LAB_00d354e0:
    pcVar47[0x60] = '\0';
    pcVar47[0x61] = '\0';
    pcVar47[0x62] = -0x80;
    pcVar47[99] = '\x7f';
    pcVar47[100] = '\0';
    pcVar47[0x65] = '\0';
    pcVar47[0x66] = -0x80;
    pcVar47[0x67] = '\x7f';
    pcVar47[0x68] = '\0';
    pcVar47[0x69] = '\0';
    pcVar47[0x6a] = -0x80;
    pcVar47[0x6b] = '\x7f';
    pcVar47[0x6c] = '\0';
    pcVar47[0x6d] = '\0';
    pcVar47[0x6e] = -0x80;
    pcVar47[0x6f] = '\x7f';
    pcVar47[0x40] = '\0';
    pcVar47[0x41] = '\0';
    pcVar47[0x42] = -0x80;
    pcVar47[0x43] = '\x7f';
    pcVar47[0x44] = '\0';
    pcVar47[0x45] = '\0';
    pcVar47[0x46] = -0x80;
    pcVar47[0x47] = '\x7f';
    pcVar47[0x48] = '\0';
    pcVar47[0x49] = '\0';
    pcVar47[0x4a] = -0x80;
    pcVar47[0x4b] = '\x7f';
    pcVar47[0x4c] = '\0';
    pcVar47[0x4d] = '\0';
    pcVar47[0x4e] = -0x80;
    pcVar47[0x4f] = '\x7f';
    pcVar47[0x20] = '\0';
    pcVar47[0x21] = '\0';
    pcVar47[0x22] = -0x80;
    pcVar47[0x23] = '\x7f';
    pcVar47[0x24] = '\0';
    pcVar47[0x25] = '\0';
    pcVar47[0x26] = -0x80;
    pcVar47[0x27] = '\x7f';
    pcVar47[0x28] = '\0';
    pcVar47[0x29] = '\0';
    pcVar47[0x2a] = -0x80;
    pcVar47[0x2b] = '\x7f';
    pcVar47[0x2c] = '\0';
    pcVar47[0x2d] = '\0';
    pcVar47[0x2e] = -0x80;
    pcVar47[0x2f] = '\x7f';
    pcVar47[0x70] = '\0';
    pcVar47[0x71] = '\0';
    pcVar47[0x72] = -0x80;
    pcVar47[0x73] = -1;
    pcVar47[0x74] = '\0';
    pcVar47[0x75] = '\0';
    pcVar47[0x76] = -0x80;
    pcVar47[0x77] = -1;
    pcVar47[0x78] = '\0';
    pcVar47[0x79] = '\0';
    pcVar47[0x7a] = -0x80;
    pcVar47[0x7b] = -1;
    pcVar47[0x7c] = '\0';
    pcVar47[0x7d] = '\0';
    pcVar47[0x7e] = -0x80;
    pcVar47[0x7f] = -1;
    pcVar47[0x50] = '\0';
    pcVar47[0x51] = '\0';
    pcVar47[0x52] = -0x80;
    pcVar47[0x53] = -1;
    pcVar47[0x54] = '\0';
    pcVar47[0x55] = '\0';
    pcVar47[0x56] = -0x80;
    pcVar47[0x57] = -1;
    pcVar47[0x58] = '\0';
    pcVar47[0x59] = '\0';
    pcVar47[0x5a] = -0x80;
    pcVar47[0x5b] = -1;
    pcVar47[0x5c] = '\0';
    pcVar47[0x5d] = '\0';
    pcVar47[0x5e] = -0x80;
    pcVar47[0x5f] = -1;
    pcVar47[0x30] = '\0';
    pcVar47[0x31] = '\0';
    pcVar47[0x32] = -0x80;
    pcVar47[0x33] = -1;
    pcVar47[0x34] = '\0';
    pcVar47[0x35] = '\0';
    pcVar47[0x36] = -0x80;
    pcVar47[0x37] = -1;
    pcVar47[0x38] = '\0';
    pcVar47[0x39] = '\0';
    pcVar47[0x3a] = -0x80;
    pcVar47[0x3b] = -1;
    pcVar47[0x3c] = '\0';
    pcVar47[0x3d] = '\0';
    pcVar47[0x3e] = -0x80;
    pcVar47[0x3f] = -1;
    pcVar47[0x80] = '\0';
    pcVar47[0x81] = '\0';
    pcVar47[0x82] = '\0';
    pcVar47[0x83] = '\0';
    pcVar47[0x84] = '\0';
    pcVar47[0x85] = '\0';
    pcVar47[0x86] = '\0';
    pcVar47[0x87] = '\0';
    pcVar47[0x88] = '\0';
    pcVar47[0x89] = '\0';
    pcVar47[0x8a] = '\0';
    pcVar47[0x8b] = '\0';
    pcVar47[0x8c] = '\0';
    pcVar47[0x8d] = '\0';
    pcVar47[0x8e] = '\0';
    pcVar47[0x8f] = '\0';
    pcVar47[0x90] = '\0';
    pcVar47[0x91] = '\0';
    pcVar47[0x92] = '\0';
    pcVar47[0x93] = '\0';
    pcVar47[0x94] = '\0';
    pcVar47[0x95] = '\0';
    pcVar47[0x96] = '\0';
    pcVar47[0x97] = '\0';
    pcVar47[0x98] = '\0';
    pcVar47[0x99] = '\0';
    pcVar47[0x9a] = '\0';
    pcVar47[0x9b] = '\0';
    pcVar47[0x9c] = '\0';
    pcVar47[0x9d] = '\0';
    pcVar47[0x9e] = '\0';
    pcVar47[0x9f] = '\0';
    pcVar47[0xa0] = '\0';
    pcVar47[0xa1] = '\0';
    pcVar47[0xa2] = '\0';
    pcVar47[0xa3] = '\0';
    pcVar47[0xa4] = '\0';
    pcVar47[0xa5] = '\0';
    pcVar47[0xa6] = '\0';
    pcVar47[0xa7] = '\0';
    pcVar47[0xa8] = '\0';
    pcVar47[0xa9] = '\0';
    pcVar47[0xaa] = '\0';
    pcVar47[0xab] = '\0';
    pcVar47[0xac] = '\0';
    pcVar47[0xad] = '\0';
    pcVar47[0xae] = '\0';
    pcVar47[0xaf] = '\0';
    pcVar47[0xb0] = '\0';
    pcVar47[0xb1] = '\0';
    pcVar47[0xb2] = '\0';
    pcVar47[0xb3] = '\0';
    pcVar47[0xb4] = '\0';
    pcVar47[0xb5] = '\0';
    pcVar47[0xb6] = '\0';
    pcVar47[0xb7] = '\0';
    pcVar47[0xb8] = '\0';
    pcVar47[0xb9] = '\0';
    pcVar47[0xba] = '\0';
    pcVar47[0xbb] = '\0';
    pcVar47[0xbc] = '\0';
    pcVar47[0xbd] = '\0';
    pcVar47[0xbe] = '\0';
    pcVar47[0xbf] = '\0';
    pcVar47[0xc0] = '\0';
    pcVar47[0xc1] = '\0';
    pcVar47[0xc2] = '\0';
    pcVar47[0xc3] = '\0';
    pcVar47[0xc4] = '\0';
    pcVar47[0xc5] = '\0';
    pcVar47[0xc6] = '\0';
    pcVar47[199] = '\0';
    pcVar47[200] = '\0';
    pcVar47[0xc9] = '\0';
    pcVar47[0xca] = '\0';
    pcVar47[0xcb] = '\0';
    pcVar47[0xcc] = '\0';
    pcVar47[0xcd] = '\0';
    pcVar47[0xce] = '\0';
    pcVar47[0xcf] = '\0';
    pcVar47[0xd0] = '\0';
    pcVar47[0xd1] = '\0';
    pcVar47[0xd2] = '\0';
    pcVar47[0xd3] = '\0';
    pcVar47[0xd4] = '\0';
    pcVar47[0xd5] = '\0';
    pcVar47[0xd6] = '\0';
    pcVar47[0xd7] = '\0';
    pcVar47[0xd8] = '\0';
    pcVar47[0xd9] = '\0';
    pcVar47[0xda] = '\0';
    pcVar47[0xdb] = '\0';
    pcVar47[0xdc] = '\0';
    pcVar47[0xdd] = '\0';
    pcVar47[0xde] = '\0';
    pcVar47[0xdf] = '\0';
    lVar38 = 0;
    do {
      pcVar45 = pcVar47 + lVar38 * 8;
      pcVar45[0] = '\b';
      pcVar45[1] = '\0';
      pcVar45[2] = '\0';
      pcVar45[3] = '\0';
      pcVar45[4] = '\0';
      pcVar45[5] = '\0';
      pcVar45[6] = '\0';
      pcVar45[7] = '\0';
      pcVar45[8] = '\b';
      pcVar45[9] = '\0';
      pcVar45[10] = '\0';
      pcVar45[0xb] = '\0';
      pcVar45[0xc] = '\0';
      pcVar45[0xd] = '\0';
      pcVar45[0xe] = '\0';
      pcVar45[0xf] = '\0';
      lVar38 = lVar38 + 2;
    } while (lVar38 != 4);
    uVar40 = 1;
    goto LAB_00d3554f;
  }
  vc1.field_0._0_8_ = 0x100;
  pTVar6 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar6->alloc)._M_b._M_p) {
    va1.field_0._8_1_ = 1;
    va1.field_0._0_8_ = pTVar6;
    MutexSys::lock(&pTVar6->mutex);
    if ((pTVar6->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((pTVar6->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar6->alloc1).bytesUsed + (pTVar6->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar6->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar6->alloc0).end + (pTVar6->alloc1).end) -
           ((pTVar6->alloc0).cur + (pTVar6->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar6->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar6->alloc1).bytesWasted + (pTVar6->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar6->alloc0).bytesUsed = 0;
    (pTVar6->alloc0).bytesWasted = 0;
    (pTVar6->alloc0).end = 0;
    (pTVar6->alloc0).allocBlockSize = 0;
    (pTVar6->alloc0).ptr = (char *)0x0;
    (pTVar6->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar6->alloc1).bytesUsed = 0;
      (pTVar6->alloc1).bytesWasted = 0;
      (pTVar6->alloc1).end = 0;
      (pTVar6->alloc1).allocBlockSize = 0;
      (pTVar6->alloc1).ptr = (char *)0x0;
      (pTVar6->alloc1).cur = 0;
    }
    else {
      (pTVar6->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar6->alloc1).ptr = (char *)0x0;
      (pTVar6->alloc1).cur = 0;
      (pTVar6->alloc1).end = 0;
      (pTVar6->alloc1).allocBlockSize = 0;
      (pTVar6->alloc1).bytesUsed = 0;
      (pTVar6->alloc1).bytesWasted = 0;
      (pTVar6->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar6->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    vc0.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    vc0.field_0._8_1_ = 1;
    vb1.field_0._0_8_ = pTVar6;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar7._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar7,(ThreadLocal2 **)&vb1);
    }
    else {
      *iVar7._M_current = (ThreadLocal2 *)vb1.field_0._0_8_;
      pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    if (vc0.field_0._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)vc0.field_0._0_8_);
    }
    if (va1.field_0._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)va1.field_0._0_8_);
    }
  }
  (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + vc1.field_0._0_8_;
  sVar42 = (alloc.talloc0)->cur;
  uVar40 = (ulong)(-(int)sVar42 & 0xf);
  uVar56 = sVar42 + vc1.field_0._0_8_ + uVar40;
  (alloc.talloc0)->cur = uVar56;
  if ((alloc.talloc0)->end < uVar56) {
    (alloc.talloc0)->cur = sVar42;
    if ((alloc.talloc0)->allocBlockSize < (ulong)(vc1.field_0._0_8_ << 2)) {
      pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc1);
    }
    else {
      vc0.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc0);
      (alloc.talloc0)->ptr = pcVar47;
      sVar42 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar42;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = vc0.field_0._0_8_;
      (alloc.talloc0)->cur = vc1.field_0._0_8_;
      this = this_01;
      if ((ulong)vc0.field_0._0_8_ < (ulong)vc1.field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        vc0.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vc0);
        (alloc.talloc0)->ptr = pcVar47;
        sVar42 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar42;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = vc0.field_0._0_8_;
        (alloc.talloc0)->cur = vc1.field_0._0_8_;
        if ((ulong)vc0.field_0._0_8_ < (ulong)vc1.field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar47 = (char *)0x0;
          this_01 = this;
          goto LAB_00d353e5;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar42;
      this_01 = this;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar40;
    pcVar47 = (alloc.talloc0)->ptr + (uVar56 - vc1.field_0._0_8_);
  }
LAB_00d353e5:
  pcVar47[0xe0] = '\0';
  pcVar47[0xe1] = '\0';
  pcVar47[0xe2] = -0x80;
  pcVar47[0xe3] = '\x7f';
  pcVar47[0xe4] = '\0';
  pcVar47[0xe5] = '\0';
  pcVar47[0xe6] = -0x80;
  pcVar47[0xe7] = '\x7f';
  pcVar47[0xe8] = '\0';
  pcVar47[0xe9] = '\0';
  pcVar47[0xea] = -0x80;
  pcVar47[0xeb] = '\x7f';
  pcVar47[0xec] = '\0';
  pcVar47[0xed] = '\0';
  pcVar47[0xee] = -0x80;
  pcVar47[0xef] = '\x7f';
  pcVar47[0xf0] = '\0';
  pcVar47[0xf1] = '\0';
  pcVar47[0xf2] = -0x80;
  pcVar47[0xf3] = -1;
  pcVar47[0xf4] = '\0';
  pcVar47[0xf5] = '\0';
  pcVar47[0xf6] = -0x80;
  pcVar47[0xf7] = -1;
  pcVar47[0xf8] = '\0';
  pcVar47[0xf9] = '\0';
  pcVar47[0xfa] = -0x80;
  pcVar47[0xfb] = -1;
  pcVar47[0xfc] = '\0';
  pcVar47[0xfd] = '\0';
  pcVar47[0xfe] = -0x80;
  pcVar47[0xff] = -1;
  pcVar47[0x60] = '\0';
  pcVar47[0x61] = '\0';
  pcVar47[0x62] = -0x80;
  pcVar47[99] = '\x7f';
  pcVar47[100] = '\0';
  pcVar47[0x65] = '\0';
  pcVar47[0x66] = -0x80;
  pcVar47[0x67] = '\x7f';
  pcVar47[0x68] = '\0';
  pcVar47[0x69] = '\0';
  pcVar47[0x6a] = -0x80;
  pcVar47[0x6b] = '\x7f';
  pcVar47[0x6c] = '\0';
  pcVar47[0x6d] = '\0';
  pcVar47[0x6e] = -0x80;
  pcVar47[0x6f] = '\x7f';
  pcVar47[0x40] = '\0';
  pcVar47[0x41] = '\0';
  pcVar47[0x42] = -0x80;
  pcVar47[0x43] = '\x7f';
  pcVar47[0x44] = '\0';
  pcVar47[0x45] = '\0';
  pcVar47[0x46] = -0x80;
  pcVar47[0x47] = '\x7f';
  pcVar47[0x48] = '\0';
  pcVar47[0x49] = '\0';
  pcVar47[0x4a] = -0x80;
  pcVar47[0x4b] = '\x7f';
  pcVar47[0x4c] = '\0';
  pcVar47[0x4d] = '\0';
  pcVar47[0x4e] = -0x80;
  pcVar47[0x4f] = '\x7f';
  pcVar47[0x20] = '\0';
  pcVar47[0x21] = '\0';
  pcVar47[0x22] = -0x80;
  pcVar47[0x23] = '\x7f';
  pcVar47[0x24] = '\0';
  pcVar47[0x25] = '\0';
  pcVar47[0x26] = -0x80;
  pcVar47[0x27] = '\x7f';
  pcVar47[0x28] = '\0';
  pcVar47[0x29] = '\0';
  pcVar47[0x2a] = -0x80;
  pcVar47[0x2b] = '\x7f';
  pcVar47[0x2c] = '\0';
  pcVar47[0x2d] = '\0';
  pcVar47[0x2e] = -0x80;
  pcVar47[0x2f] = '\x7f';
  pcVar47[0x70] = '\0';
  pcVar47[0x71] = '\0';
  pcVar47[0x72] = -0x80;
  pcVar47[0x73] = -1;
  pcVar47[0x74] = '\0';
  pcVar47[0x75] = '\0';
  pcVar47[0x76] = -0x80;
  pcVar47[0x77] = -1;
  pcVar47[0x78] = '\0';
  pcVar47[0x79] = '\0';
  pcVar47[0x7a] = -0x80;
  pcVar47[0x7b] = -1;
  pcVar47[0x7c] = '\0';
  pcVar47[0x7d] = '\0';
  pcVar47[0x7e] = -0x80;
  pcVar47[0x7f] = -1;
  pcVar47[0x50] = '\0';
  pcVar47[0x51] = '\0';
  pcVar47[0x52] = -0x80;
  pcVar47[0x53] = -1;
  pcVar47[0x54] = '\0';
  pcVar47[0x55] = '\0';
  pcVar47[0x56] = -0x80;
  pcVar47[0x57] = -1;
  pcVar47[0x58] = '\0';
  pcVar47[0x59] = '\0';
  pcVar47[0x5a] = -0x80;
  pcVar47[0x5b] = -1;
  pcVar47[0x5c] = '\0';
  pcVar47[0x5d] = '\0';
  pcVar47[0x5e] = -0x80;
  pcVar47[0x5f] = -1;
  pcVar47[0x30] = '\0';
  pcVar47[0x31] = '\0';
  pcVar47[0x32] = -0x80;
  pcVar47[0x33] = -1;
  pcVar47[0x34] = '\0';
  pcVar47[0x35] = '\0';
  pcVar47[0x36] = -0x80;
  pcVar47[0x37] = -1;
  pcVar47[0x38] = '\0';
  pcVar47[0x39] = '\0';
  pcVar47[0x3a] = -0x80;
  pcVar47[0x3b] = -1;
  pcVar47[0x3c] = '\0';
  pcVar47[0x3d] = '\0';
  pcVar47[0x3e] = -0x80;
  pcVar47[0x3f] = -1;
  pcVar47[0x80] = '\0';
  pcVar47[0x81] = '\0';
  pcVar47[0x82] = '\0';
  pcVar47[0x83] = '\0';
  pcVar47[0x84] = '\0';
  pcVar47[0x85] = '\0';
  pcVar47[0x86] = '\0';
  pcVar47[0x87] = '\0';
  pcVar47[0x88] = '\0';
  pcVar47[0x89] = '\0';
  pcVar47[0x8a] = '\0';
  pcVar47[0x8b] = '\0';
  pcVar47[0x8c] = '\0';
  pcVar47[0x8d] = '\0';
  pcVar47[0x8e] = '\0';
  pcVar47[0x8f] = '\0';
  pcVar47[0x90] = '\0';
  pcVar47[0x91] = '\0';
  pcVar47[0x92] = '\0';
  pcVar47[0x93] = '\0';
  pcVar47[0x94] = '\0';
  pcVar47[0x95] = '\0';
  pcVar47[0x96] = '\0';
  pcVar47[0x97] = '\0';
  pcVar47[0x98] = '\0';
  pcVar47[0x99] = '\0';
  pcVar47[0x9a] = '\0';
  pcVar47[0x9b] = '\0';
  pcVar47[0x9c] = '\0';
  pcVar47[0x9d] = '\0';
  pcVar47[0x9e] = '\0';
  pcVar47[0x9f] = '\0';
  pcVar47[0xa0] = '\0';
  pcVar47[0xa1] = '\0';
  pcVar47[0xa2] = '\0';
  pcVar47[0xa3] = '\0';
  pcVar47[0xa4] = '\0';
  pcVar47[0xa5] = '\0';
  pcVar47[0xa6] = '\0';
  pcVar47[0xa7] = '\0';
  pcVar47[0xa8] = '\0';
  pcVar47[0xa9] = '\0';
  pcVar47[0xaa] = '\0';
  pcVar47[0xab] = '\0';
  pcVar47[0xac] = '\0';
  pcVar47[0xad] = '\0';
  pcVar47[0xae] = '\0';
  pcVar47[0xaf] = '\0';
  pcVar47[0xb0] = '\0';
  pcVar47[0xb1] = '\0';
  pcVar47[0xb2] = '\0';
  pcVar47[0xb3] = '\0';
  pcVar47[0xb4] = '\0';
  pcVar47[0xb5] = '\0';
  pcVar47[0xb6] = '\0';
  pcVar47[0xb7] = '\0';
  pcVar47[0xb8] = '\0';
  pcVar47[0xb9] = '\0';
  pcVar47[0xba] = '\0';
  pcVar47[0xbb] = '\0';
  pcVar47[0xbc] = '\0';
  pcVar47[0xbd] = '\0';
  pcVar47[0xbe] = '\0';
  pcVar47[0xbf] = '\0';
  pcVar47[0xc0] = '\0';
  pcVar47[0xc1] = '\0';
  pcVar47[0xc2] = '\0';
  pcVar47[0xc3] = '\0';
  pcVar47[0xc4] = '\0';
  pcVar47[0xc5] = '\0';
  pcVar47[0xc6] = '\0';
  pcVar47[199] = '\0';
  pcVar47[200] = '\0';
  pcVar47[0xc9] = '\0';
  pcVar47[0xca] = '\0';
  pcVar47[0xcb] = '\0';
  pcVar47[0xcc] = '\0';
  pcVar47[0xcd] = '\0';
  pcVar47[0xce] = '\0';
  pcVar47[0xcf] = '\0';
  pcVar47[0xd0] = '\0';
  pcVar47[0xd1] = '\0';
  pcVar47[0xd2] = '\0';
  pcVar47[0xd3] = '\0';
  pcVar47[0xd4] = '\0';
  pcVar47[0xd5] = '\0';
  pcVar47[0xd6] = '\0';
  pcVar47[0xd7] = '\0';
  pcVar47[0xd8] = '\0';
  pcVar47[0xd9] = '\0';
  pcVar47[0xda] = '\0';
  pcVar47[0xdb] = '\0';
  pcVar47[0xdc] = '\0';
  pcVar47[0xdd] = '\0';
  pcVar47[0xde] = '\0';
  pcVar47[0xdf] = '\0';
  lVar38 = 0;
  do {
    pcVar45 = pcVar47 + lVar38 * 8;
    pcVar45[0] = '\b';
    pcVar45[1] = '\0';
    pcVar45[2] = '\0';
    pcVar45[3] = '\0';
    pcVar45[4] = '\0';
    pcVar45[5] = '\0';
    pcVar45[6] = '\0';
    pcVar45[7] = '\0';
    pcVar45[8] = '\b';
    pcVar45[9] = '\0';
    pcVar45[10] = '\0';
    pcVar45[0xb] = '\0';
    pcVar45[0xc] = '\0';
    pcVar45[0xd] = '\0';
    pcVar45[0xe] = '\0';
    pcVar45[0xf] = '\0';
    lVar38 = lVar38 + 2;
  } while (lVar38 != 4);
  uVar40 = 6;
LAB_00d3554f:
  local_1ed8._8_8_ = 0xff800000ff800000;
  local_1ed8._0_8_ = 0xff800000ff800000;
  local_1ec8._8_8_ = 0x7f8000007f800000;
  local_1ec8._0_8_ = 0x7f8000007f800000;
  in_00 = (BuildRecord *)&va0;
  if (local_848 != 0) {
    pBVar46 = &values[0].dt;
    uVar56 = 0;
    local_1ec8._8_8_ = 0x7f8000007f800000;
    local_1ec8._0_8_ = 0x7f8000007f800000;
    local_1e68._8_8_ = 0x7f8000007f800000;
    local_1e68._0_8_ = 0x7f8000007f800000;
    local_1ed8._8_8_ = 0xff800000ff800000;
    local_1ed8._0_8_ = 0xff800000ff800000;
    local_1e78._8_8_ = 0xff800000ff800000;
    local_1e78._0_8_ = 0xff800000ff800000;
    do {
      createLargeLeaf((NodeRecordMB4D *)&vc0,this,in_00,alloc);
      pBVar46[-10].lower = (float)vc0.field_0._0_4_;
      pBVar46[-10].upper = (float)vc0.field_0._4_4_;
      auVar81._4_4_ = vc0.field_0._20_4_;
      auVar81._0_4_ = vc0.field_0._16_4_;
      auVar81._8_4_ = vc0.field_0._24_4_;
      auVar81._12_4_ = vc0.field_0._28_4_;
      *(undefined1 (*) [16])(pBVar46 + -8) = auVar81;
      pBVar46[-6].lower = (float)vc0.field_0._32_4_;
      pBVar46[-6].upper = (float)vc0.field_0._36_4_;
      pBVar46[-5].lower = (float)vc0.field_0._40_4_;
      pBVar46[-5].upper = (float)vc0.field_0._44_4_;
      pBVar46[-4].lower = (float)local_1c88._0_4_;
      pBVar46[-4].upper = local_1c88.m128[1];
      pBVar46[-3].lower = (float)local_1c88._8_4_;
      pBVar46[-3].upper = local_1c88.m128[3];
      local_1c78._0_8_ = aVar32._0_8_;
      pBVar46[-2].lower = local_1c78.v[0];
      pBVar46[-2].upper = local_1c78.v[1];
      pBVar46[-1].lower = local_1c78.v[2];
      pBVar46[-1].upper = local_1c78.v[3];
      *pBVar46 = local_1c68;
      local_1ed8 = maxps(local_1ed8,*(undefined1 (*) [16])(pBVar46 + -6));
      local_1e68 = minps(local_1e68,*(undefined1 (*) [16])(pBVar46 + -4));
      local_1ec8 = minps(local_1ec8,auVar81);
      local_1e78 = maxps(local_1e78,*(undefined1 (*) [16])(pBVar46 + -2));
      uVar56 = uVar56 + 1;
      pBVar46 = pBVar46 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (uVar56 < local_848);
  }
  auVar62 = _DAT_01ff1820;
  auVar81 = _DAT_01ff1810;
  uVar40 = uVar40 | (ulong)pcVar47;
  if (((uint)uVar40 & 0xf) == 1) {
    if (local_848 != 0) {
      uVar48 = (ulong)pcVar47 & 0xfffffffffffffff0;
      pfVar41 = &values[0].dt.upper;
      uVar56 = 0;
      do {
        *(undefined8 *)(uVar48 + uVar56 * 8) = *(undefined8 *)(pfVar41 + -0x15);
        fVar92 = ((BBox1f *)(pfVar41 + -1))->lower;
        fVar91 = 1.0 / (*pfVar41 - fVar92);
        fVar97 = -fVar92 * fVar91;
        fVar88 = 1.0 - fVar97;
        auVar87._0_4_ = pfVar41[-0x11] * fVar88 + pfVar41[-9] * fVar97;
        auVar87._4_4_ = pfVar41[-0x10] * fVar88 + pfVar41[-8] * fVar97;
        auVar87._8_4_ = pfVar41[-0xf] * fVar88 + pfVar41[-7] * fVar97;
        auVar87._12_4_ = pfVar41[-0xe] * fVar88 + pfVar41[-6] * fVar97;
        auVar89._0_4_ = fVar88 * pfVar41[-0xd] + fVar97 * pfVar41[-5];
        auVar89._4_4_ = fVar88 * pfVar41[-0xc] + fVar97 * pfVar41[-4];
        auVar89._8_4_ = fVar88 * pfVar41[-0xb] + fVar97 * pfVar41[-3];
        auVar89._12_4_ = fVar88 * pfVar41[-10] + fVar97 * pfVar41[-2];
        fVar91 = (1.0 - fVar92) * fVar91;
        fVar92 = 1.0 - fVar91;
        auVar86._0_4_ = pfVar41[-0x11] * fVar92 + pfVar41[-9] * fVar91;
        auVar86._4_4_ = pfVar41[-0x10] * fVar92 + pfVar41[-8] * fVar91;
        auVar86._8_4_ = pfVar41[-0xf] * fVar92 + pfVar41[-7] * fVar91;
        auVar86._12_4_ = pfVar41[-0xe] * fVar92 + pfVar41[-6] * fVar91;
        auVar93._0_4_ = fVar92 * pfVar41[-0xd] + fVar91 * pfVar41[-5];
        auVar93._4_4_ = fVar92 * pfVar41[-0xc] + fVar91 * pfVar41[-4];
        auVar93._8_4_ = fVar92 * pfVar41[-0xb] + fVar91 * pfVar41[-3];
        auVar93._12_4_ = fVar92 * pfVar41[-10] + fVar91 * pfVar41[-2];
        auVar87 = minps(auVar87,auVar62);
        auVar89 = maxps(auVar89,auVar81);
        auVar86 = minps(auVar86,auVar62);
        auVar93 = maxps(auVar93,auVar81);
        fVar92 = auVar87._0_4_ - ABS(auVar87._0_4_) * 4.7683716e-07;
        fVar88 = auVar87._4_4_ - ABS(auVar87._4_4_) * 4.7683716e-07;
        fVar91 = auVar87._8_4_ - ABS(auVar87._8_4_) * 4.7683716e-07;
        fVar97 = ABS(auVar89._0_4_) * 4.7683716e-07 + auVar89._0_4_;
        fVar95 = ABS(auVar89._4_4_) * 4.7683716e-07 + auVar89._4_4_;
        fVar96 = ABS(auVar89._8_4_) * 4.7683716e-07 + auVar89._8_4_;
        *(float *)(uVar48 + 0x20 + uVar56 * 4) = fVar92;
        *(float *)(uVar48 + 0x40 + uVar56 * 4) = fVar88;
        *(float *)(uVar48 + 0x60 + uVar56 * 4) = fVar91;
        *(float *)(uVar48 + 0x30 + uVar56 * 4) = fVar97;
        *(float *)(uVar48 + 0x50 + uVar56 * 4) = fVar95;
        *(float *)(uVar48 + 0x70 + uVar56 * 4) = fVar96;
        *(float *)(uVar48 + 0x80 + uVar56 * 4) =
             (auVar86._0_4_ - ABS(auVar86._0_4_) * 4.7683716e-07) - fVar92;
        *(float *)(uVar48 + 0xa0 + uVar56 * 4) =
             (auVar86._4_4_ - ABS(auVar86._4_4_) * 4.7683716e-07) - fVar88;
        *(float *)(uVar48 + 0xc0 + uVar56 * 4) =
             (auVar86._8_4_ - ABS(auVar86._8_4_) * 4.7683716e-07) - fVar91;
        *(float *)(uVar48 + 0x90 + uVar56 * 4) =
             (ABS(auVar93._0_4_) * 4.7683716e-07 + auVar93._0_4_) - fVar97;
        *(float *)(uVar48 + 0xb0 + uVar56 * 4) =
             (ABS(auVar93._4_4_) * 4.7683716e-07 + auVar93._4_4_) - fVar95;
        *(float *)(uVar48 + 0xd0 + uVar56 * 4) =
             (ABS(auVar93._8_4_) * 4.7683716e-07 + auVar93._8_4_) - fVar96;
        uVar56 = uVar56 + 1;
        pfVar41 = pfVar41 + 0x18;
      } while (local_848 != uVar56);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<4>,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::sse2::CreateMSMBlurLeaf<4,embree::TriangleMesh,embree::TriangleMvMB<4>>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  BVar49 = BStack_18a0;
  BVar4 = local_18a8;
  if (bVar31) {
    vprimID.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vprimID.field_0.v[0] = (longlong)&local_1908;
    va1.field_0._0_8_ = 0x7f8000007f800000;
    va1.field_0._8_8_ = 0x7f8000007f800000;
    va1.field_0._16_8_ = 0xff800000ff800000;
    va1.field_0._24_8_ = 0xff800000ff800000;
    va1.field_0._32_8_ = 0x7f8000007f800000;
    va1.field_0._40_8_ = 0x7f8000007f800000;
    if ((ulong)((long)BStack_18a0 - (long)local_18a8) < 0xc00) {
      vc0.field_0._0_4_ = local_18a8.lower;
      vc0.field_0._4_4_ = local_18a8.upper;
      vc0.field_0._8_4_ = BStack_18a0.lower;
      vc0.field_0._12_4_ = BStack_18a0.upper;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&vb1,(anon_class_16_2_aeee9775 *)&vprimID,(range<unsigned_long> *)&vc0)
      ;
    }
    else {
      vc0.field_0._12_2_ = 0x401;
      vc0.field_0._32_8_ = 0;
      vc0.field_0._40_8_ = 0;
      tbb::detail::r1::initialize((task_group_context *)&vc0);
      BVar33 = BStack_18a0;
      BVar29 = local_18a8;
      BStack_18a0.lower = BVar49.lower;
      BStack_18a0.upper = BVar49.upper;
      vc1.field_0._0_4_ = BStack_18a0.lower;
      vc1.field_0._4_4_ = BStack_18a0.upper;
      local_18a8.lower = BVar4.lower;
      local_18a8.upper = BVar4.upper;
      vc1.field_0._8_4_ = local_18a8.lower;
      vc1.field_0._12_4_ = local_18a8.upper;
      vc1.field_0._16_8_ = 0x400;
      vgeomID.field_0.v[0] = (longlong)&vSplitMask;
      vgeomID.field_0.v[1] = (longlong)&vprimID;
      local_18a8 = BVar29;
      BStack_18a0 = BVar33;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&vb1,(d1 *)&vc1,(blocked_range<unsigned_long> *)&va1,
                 (LBBox<embree::Vec3fa> *)&vgeomID,
                 (anon_class_16_2_ed117de8_conflict31 *)vgeomID.field_0.v[0],
                 (anon_class_1_0_00000001 *)&vc0,(task_group_context *)this_01);
      cVar34 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vc0);
      if (cVar34 != '\0') {
        prVar44 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar44,"task cancelled");
        __cxa_throw(prVar44,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&vc0);
    }
    (__return_storage_ptr__->ref).ptr = uVar40;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = vb1.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         vb1.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = vb1.field_0._16_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         vb1.field_0._24_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = vb1.field_0._32_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         vb1.field_0._40_8_;
  }
  else {
    (__return_storage_ptr__->ref).ptr = uVar40;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1ec8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1ec8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1ed8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1ed8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1e68._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1e68._8_8_;
    local_1d58._0_8_ = local_1e78._0_8_;
    local_1d58._8_8_ = local_1e78._8_8_;
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1d58._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1d58._8_8_;
  __return_storage_ptr__->dt = BStack_1880;
  if (local_848 == 0) {
    return __return_storage_ptr__;
  }
  uVar40 = 0;
  do {
    pBVar8 = local_8c8[uVar40];
    pBVar46 = pBVar8 + 1;
    *pBVar46 = (BBox1f)((long)*pBVar46 + -1);
    if ((*pBVar46 == (BBox1f)0x0) && (BVar4 = *pBVar8, BVar4 != (BBox1f)0x0)) {
      lVar38 = *(undefined8 *)((long)BVar4 + 0x18);
      pvVar39 = *(void **)((long)BVar4 + 0x20);
      if (pvVar39 != (void *)0x0) {
        if ((ulong)(lVar38 * 0x50) < 0x1c00000) {
          alignedFree(pvVar39);
        }
        else {
          os_free(pvVar39,lVar38 * 0x50,*(bool *)((long)BVar4 + 8));
        }
      }
      if (lVar38 != 0) {
        (**(code **)**(undefined8 **)BVar4)(*(undefined8 **)BVar4,lVar38 * -0x50,1);
      }
      *(undefined8 *)((long)BVar4 + 0x10) = 0;
      *(undefined8 *)((long)BVar4 + 0x18) = 0;
      *(undefined8 *)((long)BVar4 + 0x20) = 0;
      operator_delete((void *)BVar4);
    }
    uVar40 = uVar40 + 1;
  } while (uVar40 < local_848);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }